

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx512::CurveNvIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  code *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined8 uVar30;
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  long lVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  undefined1 auVar87 [32];
  byte bVar88;
  ulong uVar89;
  uint uVar90;
  uint uVar91;
  ulong uVar92;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar100;
  undefined1 auVar109 [16];
  long lVar93;
  uint uVar94;
  ulong uVar95;
  size_t sVar96;
  byte bVar97;
  ulong uVar98;
  float fVar99;
  float fVar152;
  float fVar154;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar106 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar107 [16];
  float fVar153;
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar108 [16];
  float fVar156;
  float fVar159;
  float fVar160;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar161;
  undefined4 uVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar176 [64];
  undefined8 uVar182;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar185;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar196;
  float fVar206;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined4 local_880;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [16];
  size_t local_7f0;
  undefined1 (*local_7e8) [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [64];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  int local_59c;
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar231 [32];
  
  PVar8 = prim[1];
  uVar98 = (ulong)(byte)PVar8;
  lVar73 = uVar98 * 0x19;
  fVar196 = *(float *)(prim + lVar73 + 0x12);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar186 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar187 = vsubps_avx(auVar101,*(undefined1 (*) [16])(prim + lVar73 + 6));
  fVar195 = fVar196 * auVar187._0_4_;
  fVar161 = fVar196 * auVar186._0_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar98 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar101);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar98 * 5 + 6);
  auVar113 = vpmovsxbd_avx2(auVar29);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar98 * 6 + 6);
  auVar125 = vpmovsxbd_avx2(auVar6);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar98 * 0xb + 6);
  auVar124 = vpmovsxbd_avx2(auVar109);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar118 = vpmovsxbd_avx2(auVar104);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar116 = vcvtdq2ps_avx(auVar118);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar98 + 6);
  auVar114 = vpmovsxbd_avx2(auVar105);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar95 = (ulong)(uint)((int)(uVar98 * 9) * 2);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar95 + 6);
  auVar123 = vpmovsxbd_avx2(auVar103);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar95 + uVar98 + 6);
  auVar122 = vpmovsxbd_avx2(auVar102);
  auVar122 = vcvtdq2ps_avx(auVar122);
  uVar89 = (ulong)(uint)((int)(uVar98 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar112 = vpmovsxbd_avx2(auVar7);
  auVar117 = vcvtdq2ps_avx(auVar112);
  auVar227._4_4_ = fVar161;
  auVar227._0_4_ = fVar161;
  auVar227._8_4_ = fVar161;
  auVar227._12_4_ = fVar161;
  auVar227._16_4_ = fVar161;
  auVar227._20_4_ = fVar161;
  auVar227._24_4_ = fVar161;
  auVar227._28_4_ = fVar161;
  auVar229._8_4_ = 1;
  auVar229._0_8_ = 0x100000001;
  auVar229._12_4_ = 1;
  auVar229._16_4_ = 1;
  auVar229._20_4_ = 1;
  auVar229._24_4_ = 1;
  auVar229._28_4_ = 1;
  auVar110 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar236 = ZEXT3264(auVar110);
  auVar120 = ZEXT1632(CONCAT412(fVar196 * auVar186._12_4_,
                                CONCAT48(fVar196 * auVar186._8_4_,
                                         CONCAT44(fVar196 * auVar186._4_4_,fVar161))));
  auVar119 = vpermps_avx2(auVar229,auVar120);
  auVar111 = vpermps_avx512vl(auVar110,auVar120);
  fVar161 = auVar111._0_4_;
  fVar177 = auVar111._4_4_;
  auVar120._4_4_ = fVar177 * auVar125._4_4_;
  auVar120._0_4_ = fVar161 * auVar125._0_4_;
  fVar178 = auVar111._8_4_;
  auVar120._8_4_ = fVar178 * auVar125._8_4_;
  fVar185 = auVar111._12_4_;
  auVar120._12_4_ = fVar185 * auVar125._12_4_;
  fVar179 = auVar111._16_4_;
  auVar120._16_4_ = fVar179 * auVar125._16_4_;
  fVar180 = auVar111._20_4_;
  auVar120._20_4_ = fVar180 * auVar125._20_4_;
  fVar181 = auVar111._24_4_;
  auVar120._24_4_ = fVar181 * auVar125._24_4_;
  auVar120._28_4_ = auVar118._28_4_;
  auVar118._4_4_ = auVar114._4_4_ * fVar177;
  auVar118._0_4_ = auVar114._0_4_ * fVar161;
  auVar118._8_4_ = auVar114._8_4_ * fVar178;
  auVar118._12_4_ = auVar114._12_4_ * fVar185;
  auVar118._16_4_ = auVar114._16_4_ * fVar179;
  auVar118._20_4_ = auVar114._20_4_ * fVar180;
  auVar118._24_4_ = auVar114._24_4_ * fVar181;
  auVar118._28_4_ = auVar112._28_4_;
  auVar112._4_4_ = auVar117._4_4_ * fVar177;
  auVar112._0_4_ = auVar117._0_4_ * fVar161;
  auVar112._8_4_ = auVar117._8_4_ * fVar178;
  auVar112._12_4_ = auVar117._12_4_ * fVar185;
  auVar112._16_4_ = auVar117._16_4_ * fVar179;
  auVar112._20_4_ = auVar117._20_4_ * fVar180;
  auVar112._24_4_ = auVar117._24_4_ * fVar181;
  auVar112._28_4_ = auVar111._28_4_;
  auVar101 = vfmadd231ps_fma(auVar120,auVar119,auVar113);
  auVar29 = vfmadd231ps_fma(auVar118,auVar119,auVar116);
  auVar6 = vfmadd231ps_fma(auVar112,auVar122,auVar119);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar227,auVar115);
  auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar227,auVar124);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar123,auVar227);
  auVar228._4_4_ = fVar195;
  auVar228._0_4_ = fVar195;
  auVar228._8_4_ = fVar195;
  auVar228._12_4_ = fVar195;
  auVar228._16_4_ = fVar195;
  auVar228._20_4_ = fVar195;
  auVar228._24_4_ = fVar195;
  auVar228._28_4_ = fVar195;
  auVar112 = ZEXT1632(CONCAT412(fVar196 * auVar187._12_4_,
                                CONCAT48(fVar196 * auVar187._8_4_,
                                         CONCAT44(fVar196 * auVar187._4_4_,fVar195))));
  auVar118 = vpermps_avx2(auVar229,auVar112);
  auVar112 = vpermps_avx512vl(auVar110,auVar112);
  fVar196 = auVar112._0_4_;
  fVar161 = auVar112._4_4_;
  auVar119._4_4_ = fVar161 * auVar125._4_4_;
  auVar119._0_4_ = fVar196 * auVar125._0_4_;
  fVar177 = auVar112._8_4_;
  auVar119._8_4_ = fVar177 * auVar125._8_4_;
  fVar178 = auVar112._12_4_;
  auVar119._12_4_ = fVar178 * auVar125._12_4_;
  fVar185 = auVar112._16_4_;
  auVar119._16_4_ = fVar185 * auVar125._16_4_;
  fVar179 = auVar112._20_4_;
  auVar119._20_4_ = fVar179 * auVar125._20_4_;
  fVar180 = auVar112._24_4_;
  auVar119._24_4_ = fVar180 * auVar125._24_4_;
  auVar119._28_4_ = 1;
  auVar110._4_4_ = auVar114._4_4_ * fVar161;
  auVar110._0_4_ = auVar114._0_4_ * fVar196;
  auVar110._8_4_ = auVar114._8_4_ * fVar177;
  auVar110._12_4_ = auVar114._12_4_ * fVar178;
  auVar110._16_4_ = auVar114._16_4_ * fVar185;
  auVar110._20_4_ = auVar114._20_4_ * fVar179;
  auVar110._24_4_ = auVar114._24_4_ * fVar180;
  auVar110._28_4_ = auVar125._28_4_;
  auVar114._4_4_ = auVar117._4_4_ * fVar161;
  auVar114._0_4_ = auVar117._0_4_ * fVar196;
  auVar114._8_4_ = auVar117._8_4_ * fVar177;
  auVar114._12_4_ = auVar117._12_4_ * fVar178;
  auVar114._16_4_ = auVar117._16_4_ * fVar185;
  auVar114._20_4_ = auVar117._20_4_ * fVar179;
  auVar114._24_4_ = auVar117._24_4_ * fVar180;
  auVar114._28_4_ = auVar112._28_4_;
  auVar109 = vfmadd231ps_fma(auVar119,auVar118,auVar113);
  auVar104 = vfmadd231ps_fma(auVar110,auVar118,auVar116);
  auVar105 = vfmadd231ps_fma(auVar114,auVar118,auVar122);
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar228,auVar115);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar228,auVar124);
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar219._16_4_ = 0x7fffffff;
  auVar219._20_4_ = 0x7fffffff;
  auVar219._24_4_ = 0x7fffffff;
  auVar219._28_4_ = 0x7fffffff;
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar228,auVar123);
  auVar115 = vandps_avx(ZEXT1632(auVar101),auVar219);
  auVar217._8_4_ = 0x219392ef;
  auVar217._0_8_ = 0x219392ef219392ef;
  auVar217._12_4_ = 0x219392ef;
  auVar217._16_4_ = 0x219392ef;
  auVar217._20_4_ = 0x219392ef;
  auVar217._24_4_ = 0x219392ef;
  auVar217._28_4_ = 0x219392ef;
  uVar95 = vcmpps_avx512vl(auVar115,auVar217,1);
  bVar14 = (bool)((byte)uVar95 & 1);
  auVar111._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._0_4_;
  bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._4_4_;
  bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._8_4_;
  bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar29),auVar219);
  uVar95 = vcmpps_avx512vl(auVar115,auVar217,1);
  bVar14 = (bool)((byte)uVar95 & 1);
  auVar121._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._0_4_;
  bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar121._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._4_4_;
  bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar121._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._8_4_;
  bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar121._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar29._12_4_;
  auVar121._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar121._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar121._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar121._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar6),auVar219);
  uVar95 = vcmpps_avx512vl(auVar115,auVar217,1);
  bVar14 = (bool)((byte)uVar95 & 1);
  auVar115._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._0_4_;
  bVar14 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._4_4_;
  bVar14 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._8_4_;
  bVar14 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar6._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar113 = vrcp14ps_avx512vl(auVar111);
  auVar218._8_4_ = 0x3f800000;
  auVar218._0_8_ = 0x3f8000003f800000;
  auVar218._12_4_ = 0x3f800000;
  auVar218._16_4_ = 0x3f800000;
  auVar218._20_4_ = 0x3f800000;
  auVar218._24_4_ = 0x3f800000;
  auVar218._28_4_ = 0x3f800000;
  auVar101 = vfnmadd213ps_fma(auVar111,auVar113,auVar218);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar121);
  auVar29 = vfnmadd213ps_fma(auVar121,auVar113,auVar218);
  auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar115);
  auVar6 = vfnmadd213ps_fma(auVar115,auVar113,auVar218);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar113,auVar113);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 7 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar109));
  auVar123._4_4_ = auVar101._4_4_ * auVar115._4_4_;
  auVar123._0_4_ = auVar101._0_4_ * auVar115._0_4_;
  auVar123._8_4_ = auVar101._8_4_ * auVar115._8_4_;
  auVar123._12_4_ = auVar101._12_4_ * auVar115._12_4_;
  auVar123._16_4_ = auVar115._16_4_ * 0.0;
  auVar123._20_4_ = auVar115._20_4_ * 0.0;
  auVar123._24_4_ = auVar115._24_4_ * 0.0;
  auVar123._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 9 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar109));
  auVar114 = vpbroadcastd_avx512vl();
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar192._0_4_ = auVar101._0_4_ * auVar115._0_4_;
  auVar192._4_4_ = auVar101._4_4_ * auVar115._4_4_;
  auVar192._8_4_ = auVar101._8_4_ * auVar115._8_4_;
  auVar192._12_4_ = auVar101._12_4_ * auVar115._12_4_;
  auVar192._16_4_ = auVar115._16_4_ * 0.0;
  auVar192._20_4_ = auVar115._20_4_ * 0.0;
  auVar192._24_4_ = auVar115._24_4_ * 0.0;
  auVar192._28_4_ = 0;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar8 * 0x10 + uVar98 * -2 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar104));
  auVar122._4_4_ = auVar29._4_4_ * auVar115._4_4_;
  auVar122._0_4_ = auVar29._0_4_ * auVar115._0_4_;
  auVar122._8_4_ = auVar29._8_4_ * auVar115._8_4_;
  auVar122._12_4_ = auVar29._12_4_ * auVar115._12_4_;
  auVar122._16_4_ = auVar115._16_4_ * 0.0;
  auVar122._20_4_ = auVar115._20_4_ * 0.0;
  auVar122._24_4_ = auVar115._24_4_ * 0.0;
  auVar122._28_4_ = auVar115._28_4_;
  auVar115 = vcvtdq2ps_avx(auVar113);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar104));
  auVar183._0_4_ = auVar29._0_4_ * auVar115._0_4_;
  auVar183._4_4_ = auVar29._4_4_ * auVar115._4_4_;
  auVar183._8_4_ = auVar29._8_4_ * auVar115._8_4_;
  auVar183._12_4_ = auVar29._12_4_ * auVar115._12_4_;
  auVar183._16_4_ = auVar115._16_4_ * 0.0;
  auVar183._20_4_ = auVar115._20_4_ * 0.0;
  auVar183._24_4_ = auVar115._24_4_ * 0.0;
  auVar183._28_4_ = 0;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + uVar98 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar105));
  auVar117._4_4_ = auVar115._4_4_ * auVar6._4_4_;
  auVar117._0_4_ = auVar115._0_4_ * auVar6._0_4_;
  auVar117._8_4_ = auVar115._8_4_ * auVar6._8_4_;
  auVar117._12_4_ = auVar115._12_4_ * auVar6._12_4_;
  auVar117._16_4_ = auVar115._16_4_ * 0.0;
  auVar117._20_4_ = auVar115._20_4_ * 0.0;
  auVar117._24_4_ = auVar115._24_4_ * 0.0;
  auVar117._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 * 0x17 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar105));
  auVar126._0_4_ = auVar6._0_4_ * auVar115._0_4_;
  auVar126._4_4_ = auVar6._4_4_ * auVar115._4_4_;
  auVar126._8_4_ = auVar6._8_4_ * auVar115._8_4_;
  auVar126._12_4_ = auVar6._12_4_ * auVar115._12_4_;
  auVar126._16_4_ = auVar115._16_4_ * 0.0;
  auVar126._20_4_ = auVar115._20_4_ * 0.0;
  auVar126._24_4_ = auVar115._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar115 = vpminsd_avx2(auVar123,auVar192);
  auVar113 = vpminsd_avx2(auVar122,auVar183);
  auVar115 = vmaxps_avx(auVar115,auVar113);
  auVar113 = vpminsd_avx2(auVar117,auVar126);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar125._4_4_ = uVar3;
  auVar125._0_4_ = uVar3;
  auVar125._8_4_ = uVar3;
  auVar125._12_4_ = uVar3;
  auVar125._16_4_ = uVar3;
  auVar125._20_4_ = uVar3;
  auVar125._24_4_ = uVar3;
  auVar125._28_4_ = uVar3;
  auVar113 = vmaxps_avx512vl(auVar113,auVar125);
  auVar115 = vmaxps_avx(auVar115,auVar113);
  auVar113._8_4_ = 0x3f7ffffa;
  auVar113._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar113._12_4_ = 0x3f7ffffa;
  auVar113._16_4_ = 0x3f7ffffa;
  auVar113._20_4_ = 0x3f7ffffa;
  auVar113._24_4_ = 0x3f7ffffa;
  auVar113._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar115,auVar113);
  auVar115 = vpmaxsd_avx2(auVar123,auVar192);
  auVar113 = vpmaxsd_avx2(auVar122,auVar183);
  auVar115 = vminps_avx(auVar115,auVar113);
  auVar113 = vpmaxsd_avx2(auVar117,auVar126);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar124._4_4_ = uVar3;
  auVar124._0_4_ = uVar3;
  auVar124._8_4_ = uVar3;
  auVar124._12_4_ = uVar3;
  auVar124._16_4_ = uVar3;
  auVar124._20_4_ = uVar3;
  auVar124._24_4_ = uVar3;
  auVar124._28_4_ = uVar3;
  auVar113 = vminps_avx512vl(auVar113,auVar124);
  auVar115 = vminps_avx(auVar115,auVar113);
  auVar116._8_4_ = 0x3f800003;
  auVar116._0_8_ = 0x3f8000033f800003;
  auVar116._12_4_ = 0x3f800003;
  auVar116._16_4_ = 0x3f800003;
  auVar116._20_4_ = 0x3f800003;
  auVar116._24_4_ = 0x3f800003;
  auVar116._28_4_ = 0x3f800003;
  auVar115 = vmulps_avx512vl(auVar115,auVar116);
  uVar30 = vpcmpgtd_avx512vl(auVar114,_DAT_01fe9900);
  uVar182 = vcmpps_avx512vl(local_320,auVar115,2);
  if ((byte)((byte)uVar182 & (byte)uVar30) != 0) {
    uVar95 = (ulong)(byte)((byte)uVar182 & (byte)uVar30);
    local_7e8 = (undefined1 (*) [32])local_100;
    auVar176 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar176);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar176 = ZEXT1664(auVar101);
    auVar237 = ZEXT464(0x35000000);
    sVar96 = k;
    local_7f0 = k;
    do {
      lVar31 = 0;
      for (uVar89 = uVar95; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar95 = uVar95 - 1 & uVar95;
      uVar3 = *(undefined4 *)(prim + lVar31 * 4 + 6);
      uVar89 = (ulong)(uint)((int)lVar31 << 6);
      uVar94 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar94].ptr;
      auVar101 = *(undefined1 (*) [16])(prim + uVar89 + lVar73 + 0x16);
      if (uVar95 != 0) {
        uVar92 = uVar95 - 1 & uVar95;
        for (uVar98 = uVar95; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        }
        if (uVar92 != 0) {
          for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar29 = *(undefined1 (*) [16])(prim + uVar89 + lVar73 + 0x26);
      auVar6 = *(undefined1 (*) [16])(prim + uVar89 + lVar73 + 0x36);
      auVar109 = *(undefined1 (*) [16])(prim + uVar89 + lVar73 + 0x46);
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar96 * 4)),
                               ZEXT416(*(uint *)(ray + sVar96 * 4 + 0x40)),0x1c);
      auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + sVar96 * 4 + 0x80)),0x28);
      auVar103 = vsubps_avx(auVar101,auVar104);
      uVar162 = auVar103._0_4_;
      auVar186._4_4_ = uVar162;
      auVar186._0_4_ = uVar162;
      auVar186._8_4_ = uVar162;
      auVar186._12_4_ = uVar162;
      auVar105 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar196 = pre->ray_space[k].vz.field_0.m128[0];
      fVar161 = pre->ray_space[k].vz.field_0.m128[1];
      fVar177 = pre->ray_space[k].vz.field_0.m128[2];
      fVar178 = pre->ray_space[k].vz.field_0.m128[3];
      auVar106._0_4_ = fVar196 * auVar103._0_4_;
      auVar106._4_4_ = fVar161 * auVar103._4_4_;
      auVar106._8_4_ = fVar177 * auVar103._8_4_;
      auVar106._12_4_ = fVar178 * auVar103._12_4_;
      auVar105 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar105);
      auVar7 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar186);
      auVar105 = vshufps_avx(auVar101,auVar101,0xff);
      auVar102 = vsubps_avx(auVar29,auVar104);
      uVar162 = auVar102._0_4_;
      auVar197._4_4_ = uVar162;
      auVar197._0_4_ = uVar162;
      auVar197._8_4_ = uVar162;
      auVar197._12_4_ = uVar162;
      auVar103 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      auVar222._0_4_ = fVar196 * auVar102._0_4_;
      auVar222._4_4_ = fVar161 * auVar102._4_4_;
      auVar222._8_4_ = fVar177 * auVar102._8_4_;
      auVar222._12_4_ = fVar178 * auVar102._12_4_;
      auVar103 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar5,auVar103);
      auVar186 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar197);
      auVar102 = vsubps_avx512vl(auVar6,auVar104);
      uVar162 = auVar102._0_4_;
      auVar198._4_4_ = uVar162;
      auVar198._0_4_ = uVar162;
      auVar198._8_4_ = uVar162;
      auVar198._12_4_ = uVar162;
      auVar103 = vshufps_avx(auVar102,auVar102,0x55);
      auVar102 = vshufps_avx(auVar102,auVar102,0xaa);
      auVar107._0_4_ = fVar196 * auVar102._0_4_;
      auVar107._4_4_ = fVar161 * auVar102._4_4_;
      auVar107._8_4_ = fVar177 * auVar102._8_4_;
      auVar107._12_4_ = fVar178 * auVar102._12_4_;
      auVar103 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar103);
      auVar102 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar198);
      auVar103 = vsubps_avx512vl(auVar109,auVar104);
      uVar162 = auVar103._0_4_;
      auVar187._4_4_ = uVar162;
      auVar187._0_4_ = uVar162;
      auVar187._8_4_ = uVar162;
      auVar187._12_4_ = uVar162;
      auVar104 = vshufps_avx(auVar103,auVar103,0x55);
      auVar103 = vshufps_avx(auVar103,auVar103,0xaa);
      auVar108._0_4_ = fVar196 * auVar103._0_4_;
      auVar108._4_4_ = fVar161 * auVar103._4_4_;
      auVar108._8_4_ = fVar177 * auVar103._8_4_;
      auVar108._12_4_ = fVar178 * auVar103._12_4_;
      auVar104 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar104);
      auVar103 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar4,auVar187);
      lVar31 = (long)iVar9 * 0x44;
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar31);
      uVar162 = auVar7._0_4_;
      local_620._4_4_ = uVar162;
      local_620._0_4_ = uVar162;
      local_620._8_4_ = uVar162;
      local_620._12_4_ = uVar162;
      local_620._16_4_ = uVar162;
      local_620._20_4_ = uVar162;
      local_620._24_4_ = uVar162;
      local_620._28_4_ = uVar162;
      auVar167._8_4_ = 1;
      auVar167._0_8_ = 0x100000001;
      auVar167._12_4_ = 1;
      auVar167._16_4_ = 1;
      auVar167._20_4_ = 1;
      auVar167._24_4_ = 1;
      auVar167._28_4_ = 1;
      local_640 = vpermps_avx2(auVar167,ZEXT1632(auVar7));
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x484);
      local_660 = vbroadcastss_avx512vl(auVar186);
      local_680 = vpermps_avx512vl(auVar167,ZEXT1632(auVar186));
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x908);
      local_6a0 = vbroadcastss_avx512vl(auVar102);
      local_6c0 = vpermps_avx512vl(auVar167,ZEXT1632(auVar102));
      auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0xd8c);
      fVar185 = auVar103._0_4_;
      local_6e0._4_4_ = fVar185;
      local_6e0._0_4_ = fVar185;
      fStack_6d8 = fVar185;
      fStack_6d4 = fVar185;
      fStack_6d0 = fVar185;
      fStack_6cc = fVar185;
      fStack_6c8 = fVar185;
      register0x0000139c = fVar185;
      _local_700 = vpermps_avx512vl(auVar167,ZEXT1632(auVar103));
      auVar116 = vmulps_avx512vl(_local_6e0,auVar124);
      auVar114 = vmulps_avx512vl(_local_700,auVar124);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar125,local_6a0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar125,local_6c0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,local_660);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar113,local_680);
      auVar117 = vfmadd231ps_avx512vl(auVar116,auVar115,local_620);
      auVar216 = ZEXT3264(auVar117);
      auVar118 = vfmadd231ps_avx512vl(auVar114,auVar115,local_640);
      auVar211 = ZEXT3264(auVar118);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar31);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x484);
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x908);
      auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0xd8c);
      auVar112 = vmulps_avx512vl(_local_6e0,auVar122);
      auVar119 = vmulps_avx512vl(_local_700,auVar122);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar123,local_6a0);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_6c0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,local_660);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar114,local_680);
      auVar187 = vfmadd231ps_fma(auVar112,auVar116,local_620);
      auVar220 = ZEXT1664(auVar187);
      auVar197 = vfmadd231ps_fma(auVar119,auVar116,local_640);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar187),auVar117);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar197),auVar118);
      auVar120 = vmulps_avx512vl(auVar118,auVar112);
      auVar110 = vmulps_avx512vl(auVar117,auVar119);
      auVar120 = vsubps_avx512vl(auVar120,auVar110);
      auVar104 = vshufps_avx(auVar29,auVar29,0xff);
      uVar182 = auVar105._0_8_;
      local_340._8_8_ = uVar182;
      local_340._0_8_ = uVar182;
      local_340._16_8_ = uVar182;
      local_340._24_8_ = uVar182;
      local_360 = vbroadcastsd_avx512vl(auVar104);
      auVar104 = vshufps_avx512vl(auVar6,auVar6,0xff);
      local_380 = vbroadcastsd_avx512vl(auVar104);
      auVar104 = vshufps_avx512vl(auVar109,auVar109,0xff);
      uVar182 = auVar104._0_8_;
      local_3a0._8_8_ = uVar182;
      local_3a0._0_8_ = uVar182;
      local_3a0._16_8_ = uVar182;
      local_3a0._24_8_ = uVar182;
      auVar110 = vmulps_avx512vl(local_3a0,auVar124);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar125,local_380);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,local_360);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar115,local_340);
      auVar111 = vmulps_avx512vl(local_3a0,auVar122);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar123,local_380);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar114,local_360);
      auVar198 = vfmadd231ps_fma(auVar111,auVar116,local_340);
      auVar111 = vmulps_avx512vl(auVar119,auVar119);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar112,auVar112);
      auVar121 = vmaxps_avx512vl(auVar110,ZEXT1632(auVar198));
      auVar121 = vmulps_avx512vl(auVar121,auVar121);
      auVar111 = vmulps_avx512vl(auVar121,auVar111);
      auVar120 = vmulps_avx512vl(auVar120,auVar120);
      uVar182 = vcmpps_avx512vl(auVar120,auVar111,2);
      auVar104 = vblendps_avx(auVar7,auVar101,8);
      auVar222 = auVar176._0_16_;
      auVar105 = vandps_avx512vl(auVar104,auVar222);
      auVar104 = vblendps_avx(auVar186,auVar29,8);
      auVar104 = vandps_avx512vl(auVar104,auVar222);
      auVar105 = vmaxps_avx(auVar105,auVar104);
      auVar104 = vblendps_avx(auVar102,auVar6,8);
      auVar106 = vandps_avx512vl(auVar104,auVar222);
      auVar104 = vblendps_avx(auVar103,auVar109,8);
      auVar104 = vandps_avx512vl(auVar104,auVar222);
      auVar104 = vmaxps_avx(auVar106,auVar104);
      auVar104 = vmaxps_avx(auVar105,auVar104);
      auVar105 = vmovshdup_avx(auVar104);
      auVar105 = vmaxss_avx(auVar105,auVar104);
      auVar104 = vshufpd_avx(auVar104,auVar104,1);
      auVar104 = vmaxss_avx(auVar104,auVar105);
      local_800 = vcvtsi2ss_avx512f(auVar109,iVar9);
      auVar226._0_4_ = local_800._0_4_;
      auVar226._4_4_ = auVar226._0_4_;
      auVar226._8_4_ = auVar226._0_4_;
      auVar226._12_4_ = auVar226._0_4_;
      auVar226._16_4_ = auVar226._0_4_;
      auVar226._20_4_ = auVar226._0_4_;
      auVar226._24_4_ = auVar226._0_4_;
      auVar226._28_4_ = auVar226._0_4_;
      uVar30 = vcmpps_avx512vl(auVar226,_DAT_01faff40,0xe);
      bVar97 = (byte)uVar182 & (byte)uVar30;
      auVar104 = vmulss_avx512f(auVar104,auVar237._0_16_);
      auVar111 = auVar236._0_32_;
      auVar120 = vpermps_avx512vl(auVar111,ZEXT1632(auVar7));
      local_4a0 = vpermps_avx512vl(auVar111,ZEXT1632(auVar186));
      local_4c0 = vpermps_avx512vl(auVar111,ZEXT1632(auVar102));
      local_4e0 = vpermps_avx512vl(auVar111,ZEXT1632(auVar103));
      uVar90 = *(uint *)(ray + sVar96 * 4 + 0xc0);
      local_780._0_16_ = ZEXT416(uVar90);
      local_880 = auVar104._0_4_;
      local_840 = auVar29._0_8_;
      uStack_838 = auVar29._8_8_;
      local_850 = auVar6._0_8_;
      uStack_848 = auVar6._8_8_;
      local_860._0_4_ = auVar109._0_4_;
      fVar196 = (float)local_860;
      local_860._4_4_ = auVar109._4_4_;
      fVar161 = local_860._4_4_;
      uStack_858._0_4_ = auVar109._8_4_;
      fVar177 = (float)uStack_858;
      uStack_858._4_4_ = auVar109._12_4_;
      fVar178 = uStack_858._4_4_;
      local_860 = auVar109._0_8_;
      uStack_858 = auVar109._8_8_;
      if (bVar97 != 0) {
        auVar122 = vmulps_avx512vl(local_4e0,auVar122);
        auVar123 = vfmadd213ps_avx512vl(auVar123,local_4c0,auVar122);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_4a0,auVar123);
        auVar114 = vfmadd213ps_avx512vl(auVar116,auVar120,auVar114);
        auVar124 = vmulps_avx512vl(local_4e0,auVar124);
        auVar125 = vfmadd213ps_avx512vl(auVar125,local_4c0,auVar124);
        auVar123 = vfmadd213ps_avx512vl(auVar113,local_4a0,auVar125);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1694);
        auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1b18);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar31 + 0x1f9c);
        auVar123 = vfmadd213ps_avx512vl(auVar115,auVar120,auVar123);
        auVar223._0_4_ = fVar185 * auVar116._0_4_;
        auVar223._4_4_ = fVar185 * auVar116._4_4_;
        auVar223._8_4_ = fVar185 * auVar116._8_4_;
        auVar223._12_4_ = fVar185 * auVar116._12_4_;
        auVar223._16_4_ = fVar185 * auVar116._16_4_;
        auVar223._20_4_ = fVar185 * auVar116._20_4_;
        auVar223._24_4_ = fVar185 * auVar116._24_4_;
        auVar223._28_4_ = 0;
        auVar115 = vmulps_avx512vl(_local_700,auVar116);
        auVar116 = vmulps_avx512vl(local_4e0,auVar116);
        auVar122 = vfmadd231ps_avx512vl(auVar223,auVar124,local_6a0);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar124,local_6c0);
        auVar124 = vfmadd231ps_avx512vl(auVar116,local_4c0,auVar124);
        auVar116 = vfmadd231ps_avx512vl(auVar122,auVar125,local_660);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,local_680);
        auVar122 = vfmadd231ps_avx512vl(auVar124,local_4a0,auVar125);
        auVar109 = vfmadd231ps_fma(auVar116,auVar113,local_620);
        auVar116 = vfmadd231ps_avx512vl(auVar115,auVar113,local_640);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1210);
        auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1b18);
        auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1f9c);
        auVar122 = vfmadd231ps_avx512vl(auVar122,auVar120,auVar113);
        auVar39._4_4_ = fVar185 * auVar124._4_4_;
        auVar39._0_4_ = fVar185 * auVar124._0_4_;
        auVar39._8_4_ = fVar185 * auVar124._8_4_;
        auVar39._12_4_ = fVar185 * auVar124._12_4_;
        auVar39._16_4_ = fVar185 * auVar124._16_4_;
        auVar39._20_4_ = fVar185 * auVar124._20_4_;
        auVar39._24_4_ = fVar185 * auVar124._24_4_;
        auVar39._28_4_ = auVar113._28_4_;
        auVar113 = vmulps_avx512vl(_local_700,auVar124);
        auVar124 = vmulps_avx512vl(local_4e0,auVar124);
        auVar121 = vfmadd231ps_avx512vl(auVar39,auVar125,local_6a0);
        auVar126 = vfmadd231ps_avx512vl(auVar113,auVar125,local_6c0);
        auVar235 = ZEXT3264(auVar120);
        auVar125 = vfmadd231ps_avx512vl(auVar124,local_4c0,auVar125);
        auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar31 + 0x1694);
        auVar124 = vfmadd231ps_avx512vl(auVar121,auVar113,local_660);
        auVar121 = vfmadd231ps_avx512vl(auVar126,auVar113,local_680);
        auVar113 = vfmadd231ps_avx512vl(auVar125,local_4a0,auVar113);
        auVar237 = ZEXT1664(auVar237._0_16_);
        auVar236 = ZEXT3264(auVar111);
        auVar176 = ZEXT1664(auVar222);
        auVar104 = vfmadd231ps_fma(auVar124,auVar115,local_620);
        auVar125 = vfmadd231ps_avx512vl(auVar121,auVar115,local_640);
        auVar124 = vfmadd231ps_avx512vl(auVar113,auVar120,auVar115);
        auVar230._8_4_ = 0x7fffffff;
        auVar230._0_8_ = 0x7fffffff7fffffff;
        auVar230._12_4_ = 0x7fffffff;
        auVar230._16_4_ = 0x7fffffff;
        auVar230._20_4_ = 0x7fffffff;
        auVar230._24_4_ = 0x7fffffff;
        auVar230._28_4_ = 0x7fffffff;
        auVar115 = vandps_avx(ZEXT1632(auVar109),auVar230);
        auVar113 = vandps_avx(auVar116,auVar230);
        auVar113 = vmaxps_avx(auVar115,auVar113);
        auVar115 = vandps_avx(auVar122,auVar230);
        auVar115 = vmaxps_avx(auVar113,auVar115);
        auVar225._4_4_ = local_880;
        auVar225._0_4_ = local_880;
        auVar225._8_4_ = local_880;
        auVar225._12_4_ = local_880;
        auVar225._16_4_ = local_880;
        auVar225._20_4_ = local_880;
        auVar225._24_4_ = local_880;
        auVar225._28_4_ = local_880;
        uVar89 = vcmpps_avx512vl(auVar115,auVar225,1);
        bVar14 = (bool)((byte)uVar89 & 1);
        auVar127._0_4_ = (float)((uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar109._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar109._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar109._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar109._12_4_);
        fVar185 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar112._16_4_);
        auVar127._16_4_ = fVar185;
        fVar180 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar112._20_4_);
        auVar127._20_4_ = fVar180;
        fVar179 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar112._24_4_);
        auVar127._24_4_ = fVar179;
        uVar91 = (uint)(byte)(uVar89 >> 7) * auVar112._28_4_;
        auVar127._28_4_ = uVar91;
        bVar14 = (bool)((byte)uVar89 & 1);
        auVar128._0_4_ = (float)((uint)bVar14 * auVar119._0_4_ | (uint)!bVar14 * auVar116._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar116._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar116._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar116._12_4_);
        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * auVar116._16_4_);
        bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * auVar116._20_4_);
        bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * auVar116._24_4_);
        bVar14 = SUB81(uVar89 >> 7,0);
        auVar128._28_4_ = (uint)bVar14 * auVar119._28_4_ | (uint)!bVar14 * auVar116._28_4_;
        auVar115 = vandps_avx(auVar230,ZEXT1632(auVar104));
        auVar113 = vandps_avx(auVar125,auVar230);
        auVar113 = vmaxps_avx(auVar115,auVar113);
        auVar115 = vandps_avx(auVar124,auVar230);
        auVar115 = vmaxps_avx(auVar113,auVar115);
        uVar89 = vcmpps_avx512vl(auVar115,auVar225,1);
        bVar14 = (bool)((byte)uVar89 & 1);
        auVar129._0_4_ = (float)((uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar104._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar104._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar104._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar104._12_4_);
        fVar206 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar112._16_4_);
        auVar129._16_4_ = fVar206;
        fVar195 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar112._20_4_);
        auVar129._20_4_ = fVar195;
        fVar181 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar112._24_4_);
        auVar129._24_4_ = fVar181;
        auVar129._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar112._28_4_;
        bVar14 = (bool)((byte)uVar89 & 1);
        auVar130._0_4_ = (float)((uint)bVar14 * auVar119._0_4_ | (uint)!bVar14 * auVar125._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar125._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar125._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar125._12_4_);
        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar14 * auVar119._16_4_ | (uint)!bVar14 * auVar125._16_4_);
        bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar14 * auVar119._20_4_ | (uint)!bVar14 * auVar125._20_4_);
        bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar14 * auVar119._24_4_ | (uint)!bVar14 * auVar125._24_4_);
        bVar14 = SUB81(uVar89 >> 7,0);
        auVar130._28_4_ = (uint)bVar14 * auVar119._28_4_ | (uint)!bVar14 * auVar125._28_4_;
        auVar107 = vxorps_avx512vl(local_660._0_16_,local_660._0_16_);
        auVar115 = vfmadd213ps_avx512vl(auVar127,auVar127,ZEXT1632(auVar107));
        auVar109 = vfmadd231ps_fma(auVar115,auVar128,auVar128);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar109));
        fVar99 = auVar115._0_4_;
        fVar100 = auVar115._4_4_;
        fVar152 = auVar115._8_4_;
        fVar153 = auVar115._12_4_;
        fVar154 = auVar115._16_4_;
        fVar155 = auVar115._20_4_;
        fVar157 = auVar115._24_4_;
        auVar40._4_4_ = fVar100 * fVar100 * fVar100 * auVar109._4_4_ * -0.5;
        auVar40._0_4_ = fVar99 * fVar99 * fVar99 * auVar109._0_4_ * -0.5;
        auVar40._8_4_ = fVar152 * fVar152 * fVar152 * auVar109._8_4_ * -0.5;
        auVar40._12_4_ = fVar153 * fVar153 * fVar153 * auVar109._12_4_ * -0.5;
        auVar40._16_4_ = fVar154 * fVar154 * fVar154 * -0.0;
        auVar40._20_4_ = fVar155 * fVar155 * fVar155 * -0.0;
        auVar40._24_4_ = fVar157 * fVar157 * fVar157 * -0.0;
        auVar40._28_4_ = 0;
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar125 = vfmadd231ps_avx512vl(auVar40,auVar113,auVar115);
        auVar41._4_4_ = auVar128._4_4_ * auVar125._4_4_;
        auVar41._0_4_ = auVar128._0_4_ * auVar125._0_4_;
        auVar41._8_4_ = auVar128._8_4_ * auVar125._8_4_;
        auVar41._12_4_ = auVar128._12_4_ * auVar125._12_4_;
        auVar41._16_4_ = auVar128._16_4_ * auVar125._16_4_;
        auVar41._20_4_ = auVar128._20_4_ * auVar125._20_4_;
        auVar41._24_4_ = auVar128._24_4_ * auVar125._24_4_;
        auVar41._28_4_ = auVar115._28_4_;
        auVar42._4_4_ = auVar125._4_4_ * -auVar127._4_4_;
        auVar42._0_4_ = auVar125._0_4_ * -auVar127._0_4_;
        auVar42._8_4_ = auVar125._8_4_ * -auVar127._8_4_;
        auVar42._12_4_ = auVar125._12_4_ * -auVar127._12_4_;
        auVar42._16_4_ = auVar125._16_4_ * -fVar185;
        auVar42._20_4_ = auVar125._20_4_ * -fVar180;
        auVar42._24_4_ = auVar125._24_4_ * -fVar179;
        auVar42._28_4_ = uVar91 ^ 0x80000000;
        auVar115 = vmulps_avx512vl(auVar125,ZEXT1632(auVar107));
        auVar112 = ZEXT1632(auVar107);
        auVar124 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar112);
        auVar109 = vfmadd231ps_fma(auVar124,auVar130,auVar130);
        auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar109));
        fVar185 = auVar124._0_4_;
        fVar179 = auVar124._4_4_;
        fVar180 = auVar124._8_4_;
        fVar99 = auVar124._12_4_;
        fVar100 = auVar124._16_4_;
        fVar152 = auVar124._20_4_;
        fVar153 = auVar124._24_4_;
        auVar43._4_4_ = fVar179 * fVar179 * fVar179 * auVar109._4_4_ * -0.5;
        auVar43._0_4_ = fVar185 * fVar185 * fVar185 * auVar109._0_4_ * -0.5;
        auVar43._8_4_ = fVar180 * fVar180 * fVar180 * auVar109._8_4_ * -0.5;
        auVar43._12_4_ = fVar99 * fVar99 * fVar99 * auVar109._12_4_ * -0.5;
        auVar43._16_4_ = fVar100 * fVar100 * fVar100 * -0.0;
        auVar43._20_4_ = fVar152 * fVar152 * fVar152 * -0.0;
        auVar43._24_4_ = fVar153 * fVar153 * fVar153 * -0.0;
        auVar43._28_4_ = 0;
        auVar113 = vfmadd231ps_avx512vl(auVar43,auVar113,auVar124);
        auVar44._4_4_ = auVar130._4_4_ * auVar113._4_4_;
        auVar44._0_4_ = auVar130._0_4_ * auVar113._0_4_;
        auVar44._8_4_ = auVar130._8_4_ * auVar113._8_4_;
        auVar44._12_4_ = auVar130._12_4_ * auVar113._12_4_;
        auVar44._16_4_ = auVar130._16_4_ * auVar113._16_4_;
        auVar44._20_4_ = auVar130._20_4_ * auVar113._20_4_;
        auVar44._24_4_ = auVar130._24_4_ * auVar113._24_4_;
        auVar44._28_4_ = auVar124._28_4_;
        auVar45._4_4_ = -auVar129._4_4_ * auVar113._4_4_;
        auVar45._0_4_ = -auVar129._0_4_ * auVar113._0_4_;
        auVar45._8_4_ = -auVar129._8_4_ * auVar113._8_4_;
        auVar45._12_4_ = -auVar129._12_4_ * auVar113._12_4_;
        auVar45._16_4_ = -fVar206 * auVar113._16_4_;
        auVar45._20_4_ = -fVar195 * auVar113._20_4_;
        auVar45._24_4_ = -fVar181 * auVar113._24_4_;
        auVar45._28_4_ = auVar125._28_4_;
        auVar113 = vmulps_avx512vl(auVar113,auVar112);
        auVar109 = vfmadd213ps_fma(auVar41,auVar110,auVar117);
        auVar104 = vfmadd213ps_fma(auVar42,auVar110,auVar118);
        auVar125 = vfmadd213ps_avx512vl(auVar115,auVar110,auVar123);
        auVar124 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar198),ZEXT1632(auVar187));
        auVar186 = vfnmadd213ps_fma(auVar41,auVar110,auVar117);
        auVar122 = ZEXT1632(auVar198);
        auVar105 = vfmadd213ps_fma(auVar45,auVar122,ZEXT1632(auVar197));
        auVar106 = vfnmadd213ps_fma(auVar42,auVar110,auVar118);
        auVar103 = vfmadd213ps_fma(auVar113,auVar122,auVar114);
        auVar116 = vfnmadd231ps_avx512vl(auVar123,auVar110,auVar115);
        auVar187 = vfnmadd213ps_fma(auVar44,auVar122,ZEXT1632(auVar187));
        auVar197 = vfnmadd213ps_fma(auVar45,auVar122,ZEXT1632(auVar197));
        auVar222 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar198),auVar113);
        auVar113 = vsubps_avx512vl(auVar124,ZEXT1632(auVar186));
        auVar115 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar106));
        auVar114 = vsubps_avx512vl(ZEXT1632(auVar103),auVar116);
        auVar123 = vmulps_avx512vl(auVar115,auVar116);
        auVar102 = vfmsub231ps_fma(auVar123,ZEXT1632(auVar106),auVar114);
        auVar46._4_4_ = auVar186._4_4_ * auVar114._4_4_;
        auVar46._0_4_ = auVar186._0_4_ * auVar114._0_4_;
        auVar46._8_4_ = auVar186._8_4_ * auVar114._8_4_;
        auVar46._12_4_ = auVar186._12_4_ * auVar114._12_4_;
        auVar46._16_4_ = auVar114._16_4_ * 0.0;
        auVar46._20_4_ = auVar114._20_4_ * 0.0;
        auVar46._24_4_ = auVar114._24_4_ * 0.0;
        auVar46._28_4_ = auVar114._28_4_;
        auVar114 = vfmsub231ps_avx512vl(auVar46,auVar116,auVar113);
        auVar47._4_4_ = auVar106._4_4_ * auVar113._4_4_;
        auVar47._0_4_ = auVar106._0_4_ * auVar113._0_4_;
        auVar47._8_4_ = auVar106._8_4_ * auVar113._8_4_;
        auVar47._12_4_ = auVar106._12_4_ * auVar113._12_4_;
        auVar47._16_4_ = auVar113._16_4_ * 0.0;
        auVar47._20_4_ = auVar113._20_4_ * 0.0;
        auVar47._24_4_ = auVar113._24_4_ * 0.0;
        auVar47._28_4_ = auVar113._28_4_;
        auVar7 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar186),auVar115);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar112,auVar114);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,ZEXT1632(auVar102));
        auVar119 = ZEXT1632(auVar107);
        uVar89 = vcmpps_avx512vl(auVar115,auVar119,2);
        bVar88 = (byte)uVar89;
        fVar99 = (float)((uint)(bVar88 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar88 & 1) * auVar187._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar152 = (float)((uint)bVar14 * auVar109._4_4_ | (uint)!bVar14 * auVar187._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar154 = (float)((uint)bVar14 * auVar109._8_4_ | (uint)!bVar14 * auVar187._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar157 = (float)((uint)bVar14 * auVar109._12_4_ | (uint)!bVar14 * auVar187._12_4_);
        auVar123 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar154,CONCAT44(fVar152,fVar99))));
        fVar100 = (float)((uint)(bVar88 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * auVar197._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        fVar153 = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar197._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        fVar155 = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar197._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        fVar158 = (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar197._12_4_);
        auVar122 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar155,CONCAT44(fVar153,fVar100))));
        auVar131._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar222._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar222._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar222._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar222._12_4_);
        fVar179 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_);
        auVar131._16_4_ = fVar179;
        fVar185 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_);
        auVar131._20_4_ = fVar185;
        fVar180 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_);
        auVar131._24_4_ = fVar180;
        iVar1 = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
        auVar131._28_4_ = iVar1;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar186),auVar124);
        auVar132._0_4_ =
             (uint)(bVar88 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar102._0_4_;
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar102._4_4_;
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar102._8_4_;
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar102._12_4_;
        auVar132._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar113._16_4_;
        auVar132._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar113._20_4_;
        auVar132._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar113._24_4_;
        auVar132._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar105));
        auVar133._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar113._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar104._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar104._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar104._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar104._12_4_);
        fVar206 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar113._16_4_);
        auVar133._16_4_ = fVar206;
        fVar195 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar113._20_4_);
        auVar133._20_4_ = fVar195;
        fVar181 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar113._24_4_);
        auVar133._24_4_ = fVar181;
        auVar133._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar113._28_4_;
        auVar113 = vblendmps_avx512vl(auVar116,ZEXT1632(auVar103));
        auVar134._0_4_ =
             (float)((uint)(bVar88 & 1) * auVar113._0_4_ |
                    (uint)!(bool)(bVar88 & 1) * auVar125._0_4_);
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar125._4_4_);
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar125._8_4_);
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar125._12_4_);
        bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar125._16_4_);
        bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar125._20_4_);
        bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar125._24_4_);
        bVar14 = SUB81(uVar89 >> 7,0);
        auVar134._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar125._28_4_;
        auVar135._0_4_ =
             (uint)(bVar88 & 1) * (int)auVar186._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar124._0_4_;
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar14 * (int)auVar186._4_4_ | (uint)!bVar14 * auVar124._4_4_;
        bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar14 * (int)auVar186._8_4_ | (uint)!bVar14 * auVar124._8_4_;
        bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar14 * (int)auVar186._12_4_ | (uint)!bVar14 * auVar124._12_4_;
        auVar135._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar124._16_4_;
        auVar135._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar124._20_4_;
        auVar135._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar124._24_4_;
        auVar135._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar124._28_4_;
        bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar136._0_4_ =
             (uint)(bVar88 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar103._0_4_;
        bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar15 * auVar116._4_4_ | (uint)!bVar15 * auVar103._4_4_;
        bVar15 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar15 * auVar116._8_4_ | (uint)!bVar15 * auVar103._8_4_;
        bVar15 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar15 * auVar116._12_4_ | (uint)!bVar15 * auVar103._12_4_;
        auVar136._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar116._16_4_;
        auVar136._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar116._20_4_;
        auVar136._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar116._24_4_;
        iVar2 = (uint)(byte)(uVar89 >> 7) * auVar116._28_4_;
        auVar136._28_4_ = iVar2;
        auVar117 = vsubps_avx512vl(auVar135,auVar123);
        auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar106._12_4_ |
                                                 (uint)!bVar17 * auVar105._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar106._8_4_ |
                                                          (uint)!bVar16 * auVar105._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar106._4_4_ |
                                                                   (uint)!bVar14 * auVar105._4_4_,
                                                                   (uint)(bVar88 & 1) *
                                                                   (int)auVar106._0_4_ |
                                                                   (uint)!(bool)(bVar88 & 1) *
                                                                   auVar105._0_4_)))),auVar122);
        auVar216 = ZEXT3264(auVar113);
        auVar125 = vsubps_avx(auVar136,auVar131);
        auVar124 = vsubps_avx(auVar123,auVar132);
        auVar220 = ZEXT3264(auVar124);
        auVar116 = vsubps_avx(auVar122,auVar133);
        auVar114 = vsubps_avx(auVar131,auVar134);
        auVar48._4_4_ = auVar125._4_4_ * fVar152;
        auVar48._0_4_ = auVar125._0_4_ * fVar99;
        auVar48._8_4_ = auVar125._8_4_ * fVar154;
        auVar48._12_4_ = auVar125._12_4_ * fVar157;
        auVar48._16_4_ = auVar125._16_4_ * 0.0;
        auVar48._20_4_ = auVar125._20_4_ * 0.0;
        auVar48._24_4_ = auVar125._24_4_ * 0.0;
        auVar48._28_4_ = iVar2;
        auVar109 = vfmsub231ps_fma(auVar48,auVar131,auVar117);
        auVar49._4_4_ = fVar153 * auVar117._4_4_;
        auVar49._0_4_ = fVar100 * auVar117._0_4_;
        auVar49._8_4_ = fVar155 * auVar117._8_4_;
        auVar49._12_4_ = fVar158 * auVar117._12_4_;
        auVar49._16_4_ = auVar117._16_4_ * 0.0;
        auVar49._20_4_ = auVar117._20_4_ * 0.0;
        auVar49._24_4_ = auVar117._24_4_ * 0.0;
        auVar49._28_4_ = auVar115._28_4_;
        auVar104 = vfmsub231ps_fma(auVar49,auVar123,auVar113);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar119,ZEXT1632(auVar109));
        auVar207._0_4_ = auVar113._0_4_ * auVar131._0_4_;
        auVar207._4_4_ = auVar113._4_4_ * auVar131._4_4_;
        auVar207._8_4_ = auVar113._8_4_ * auVar131._8_4_;
        auVar207._12_4_ = auVar113._12_4_ * auVar131._12_4_;
        auVar207._16_4_ = auVar113._16_4_ * fVar179;
        auVar207._20_4_ = auVar113._20_4_ * fVar185;
        auVar207._24_4_ = auVar113._24_4_ * fVar180;
        auVar207._28_4_ = 0;
        auVar109 = vfmsub231ps_fma(auVar207,auVar122,auVar125);
        auVar118 = vfmadd231ps_avx512vl(auVar115,auVar119,ZEXT1632(auVar109));
        auVar115 = vmulps_avx512vl(auVar114,auVar132);
        auVar115 = vfmsub231ps_avx512vl(auVar115,auVar124,auVar134);
        auVar50._4_4_ = auVar116._4_4_ * auVar134._4_4_;
        auVar50._0_4_ = auVar116._0_4_ * auVar134._0_4_;
        auVar50._8_4_ = auVar116._8_4_ * auVar134._8_4_;
        auVar50._12_4_ = auVar116._12_4_ * auVar134._12_4_;
        auVar50._16_4_ = auVar116._16_4_ * auVar134._16_4_;
        auVar50._20_4_ = auVar116._20_4_ * auVar134._20_4_;
        auVar50._24_4_ = auVar116._24_4_ * auVar134._24_4_;
        auVar50._28_4_ = auVar134._28_4_;
        auVar109 = vfmsub231ps_fma(auVar50,auVar133,auVar114);
        auVar208._0_4_ = auVar133._0_4_ * auVar124._0_4_;
        auVar208._4_4_ = auVar133._4_4_ * auVar124._4_4_;
        auVar208._8_4_ = auVar133._8_4_ * auVar124._8_4_;
        auVar208._12_4_ = auVar133._12_4_ * auVar124._12_4_;
        auVar208._16_4_ = fVar206 * auVar124._16_4_;
        auVar208._20_4_ = fVar195 * auVar124._20_4_;
        auVar208._24_4_ = fVar181 * auVar124._24_4_;
        auVar208._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar208,auVar116,auVar132);
        auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar119,auVar115);
        auVar112 = vfmadd231ps_avx512vl(auVar115,auVar119,ZEXT1632(auVar109));
        auVar211 = ZEXT3264(auVar112);
        auVar115 = vmaxps_avx(auVar118,auVar112);
        uVar182 = vcmpps_avx512vl(auVar115,auVar119,2);
        bVar97 = bVar97 & (byte)uVar182;
        if (bVar97 != 0) {
          uVar162 = *(undefined4 *)(ray + sVar96 * 4 + 0x200);
          auVar231._4_4_ = uVar162;
          auVar231._0_4_ = uVar162;
          auVar231._8_4_ = uVar162;
          auVar231._12_4_ = uVar162;
          auVar231._16_4_ = uVar162;
          auVar231._20_4_ = uVar162;
          auVar231._24_4_ = uVar162;
          auVar231._28_4_ = uVar162;
          auVar234 = ZEXT3264(auVar231);
          auVar51._4_4_ = auVar114._4_4_ * auVar113._4_4_;
          auVar51._0_4_ = auVar114._0_4_ * auVar113._0_4_;
          auVar51._8_4_ = auVar114._8_4_ * auVar113._8_4_;
          auVar51._12_4_ = auVar114._12_4_ * auVar113._12_4_;
          auVar51._16_4_ = auVar114._16_4_ * auVar113._16_4_;
          auVar51._20_4_ = auVar114._20_4_ * auVar113._20_4_;
          auVar51._24_4_ = auVar114._24_4_ * auVar113._24_4_;
          auVar51._28_4_ = auVar115._28_4_;
          auVar103 = vfmsub231ps_fma(auVar51,auVar116,auVar125);
          auVar52._4_4_ = auVar125._4_4_ * auVar124._4_4_;
          auVar52._0_4_ = auVar125._0_4_ * auVar124._0_4_;
          auVar52._8_4_ = auVar125._8_4_ * auVar124._8_4_;
          auVar52._12_4_ = auVar125._12_4_ * auVar124._12_4_;
          auVar52._16_4_ = auVar125._16_4_ * auVar124._16_4_;
          auVar52._20_4_ = auVar125._20_4_ * auVar124._20_4_;
          auVar52._24_4_ = auVar125._24_4_ * auVar124._24_4_;
          auVar52._28_4_ = auVar125._28_4_;
          auVar105 = vfmsub231ps_fma(auVar52,auVar117,auVar114);
          auVar53._4_4_ = auVar116._4_4_ * auVar117._4_4_;
          auVar53._0_4_ = auVar116._0_4_ * auVar117._0_4_;
          auVar53._8_4_ = auVar116._8_4_ * auVar117._8_4_;
          auVar53._12_4_ = auVar116._12_4_ * auVar117._12_4_;
          auVar53._16_4_ = auVar116._16_4_ * auVar117._16_4_;
          auVar53._20_4_ = auVar116._20_4_ * auVar117._20_4_;
          auVar53._24_4_ = auVar116._24_4_ * auVar117._24_4_;
          auVar53._28_4_ = auVar116._28_4_;
          auVar102 = vfmsub231ps_fma(auVar53,auVar124,auVar113);
          auVar109 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar102));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar103),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar115 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
          auVar220 = ZEXT3264(auVar115);
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar113 = vfnmadd213ps_avx512vl(auVar115,ZEXT1632(auVar104),auVar32);
          auVar109 = vfmadd132ps_fma(auVar113,auVar115,auVar115);
          auVar216 = ZEXT1664(auVar109);
          auVar54._4_4_ = auVar102._4_4_ * auVar131._4_4_;
          auVar54._0_4_ = auVar102._0_4_ * auVar131._0_4_;
          auVar54._8_4_ = auVar102._8_4_ * auVar131._8_4_;
          auVar54._12_4_ = auVar102._12_4_ * auVar131._12_4_;
          auVar54._16_4_ = fVar179 * 0.0;
          auVar54._20_4_ = fVar185 * 0.0;
          auVar54._24_4_ = fVar180 * 0.0;
          auVar54._28_4_ = iVar1;
          auVar105 = vfmadd231ps_fma(auVar54,auVar122,ZEXT1632(auVar105));
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar123,ZEXT1632(auVar103));
          fVar185 = auVar109._0_4_;
          fVar179 = auVar109._4_4_;
          fVar180 = auVar109._8_4_;
          fVar181 = auVar109._12_4_;
          local_7c0 = ZEXT1632(CONCAT412(auVar105._12_4_ * fVar181,
                                         CONCAT48(auVar105._8_4_ * fVar180,
                                                  CONCAT44(auVar105._4_4_ * fVar179,
                                                           auVar105._0_4_ * fVar185))));
          auVar221 = ZEXT3264(local_7c0);
          auVar168._4_4_ = uVar90;
          auVar168._0_4_ = uVar90;
          auVar168._8_4_ = uVar90;
          auVar168._12_4_ = uVar90;
          auVar168._16_4_ = uVar90;
          auVar168._20_4_ = uVar90;
          auVar168._24_4_ = uVar90;
          auVar168._28_4_ = uVar90;
          uVar182 = vcmpps_avx512vl(local_7c0,auVar231,2);
          uVar30 = vcmpps_avx512vl(auVar168,local_7c0,2);
          bVar97 = (byte)uVar182 & (byte)uVar30 & bVar97;
          if (bVar97 != 0) {
            uVar98 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar98 = bVar97 & uVar98;
            if ((char)uVar98 != '\0') {
              fVar195 = auVar118._0_4_ * fVar185;
              fVar206 = auVar118._4_4_ * fVar179;
              auVar55._4_4_ = fVar206;
              auVar55._0_4_ = fVar195;
              fVar99 = auVar118._8_4_ * fVar180;
              auVar55._8_4_ = fVar99;
              fVar100 = auVar118._12_4_ * fVar181;
              auVar55._12_4_ = fVar100;
              fVar152 = auVar118._16_4_ * 0.0;
              auVar55._16_4_ = fVar152;
              fVar153 = auVar118._20_4_ * 0.0;
              auVar55._20_4_ = fVar153;
              fVar154 = auVar118._24_4_ * 0.0;
              auVar55._24_4_ = fVar154;
              auVar55._28_4_ = auVar118._28_4_;
              auVar169._8_4_ = 0x3f800000;
              auVar169._0_8_ = 0x3f8000003f800000;
              auVar169._12_4_ = 0x3f800000;
              auVar169._16_4_ = 0x3f800000;
              auVar169._20_4_ = 0x3f800000;
              auVar169._24_4_ = 0x3f800000;
              auVar169._28_4_ = 0x3f800000;
              auVar115 = vsubps_avx(auVar169,auVar55);
              local_600._0_4_ =
                   (float)((uint)(bVar88 & 1) * (int)fVar195 |
                          (uint)!(bool)(bVar88 & 1) * auVar115._0_4_);
              bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
              local_600._4_4_ =
                   (float)((uint)bVar14 * (int)fVar206 | (uint)!bVar14 * auVar115._4_4_);
              bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
              local_600._8_4_ = (float)((uint)bVar14 * (int)fVar99 | (uint)!bVar14 * auVar115._8_4_)
              ;
              bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
              local_600._12_4_ =
                   (float)((uint)bVar14 * (int)fVar100 | (uint)!bVar14 * auVar115._12_4_);
              bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
              local_600._16_4_ =
                   (float)((uint)bVar14 * (int)fVar152 | (uint)!bVar14 * auVar115._16_4_);
              bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
              local_600._20_4_ =
                   (float)((uint)bVar14 * (int)fVar153 | (uint)!bVar14 * auVar115._20_4_);
              bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
              local_600._24_4_ =
                   (float)((uint)bVar14 * (int)fVar154 | (uint)!bVar14 * auVar115._24_4_);
              bVar14 = SUB81(uVar89 >> 7,0);
              local_600._28_4_ =
                   (float)((uint)bVar14 * auVar118._28_4_ | (uint)!bVar14 * auVar115._28_4_);
              auVar115 = vsubps_avx(ZEXT1632(auVar198),auVar110);
              auVar109 = vfmadd213ps_fma(auVar115,local_600,auVar110);
              uVar162 = *(undefined4 *)((long)pre->ray_space + sVar96 * 4 + -0x40);
              auVar33._4_4_ = uVar162;
              auVar33._0_4_ = uVar162;
              auVar33._8_4_ = uVar162;
              auVar33._12_4_ = uVar162;
              auVar33._16_4_ = uVar162;
              auVar33._20_4_ = uVar162;
              auVar33._24_4_ = uVar162;
              auVar33._28_4_ = uVar162;
              auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar109._12_4_ + auVar109._12_4_,
                                                            CONCAT48(auVar109._8_4_ + auVar109._8_4_
                                                                     ,CONCAT44(auVar109._4_4_ +
                                                                               auVar109._4_4_,
                                                                               auVar109._0_4_ +
                                                                               auVar109._0_4_)))),
                                         auVar33);
              uVar92 = vcmpps_avx512vl(local_7c0,auVar115,6);
              uVar98 = uVar98 & uVar92;
              bVar97 = (byte)uVar98;
              if (bVar97 != 0) {
                auVar193._0_4_ = auVar112._0_4_ * fVar185;
                auVar193._4_4_ = auVar112._4_4_ * fVar179;
                auVar193._8_4_ = auVar112._8_4_ * fVar180;
                auVar193._12_4_ = auVar112._12_4_ * fVar181;
                auVar193._16_4_ = auVar112._16_4_ * 0.0;
                auVar193._20_4_ = auVar112._20_4_ * 0.0;
                auVar193._24_4_ = auVar112._24_4_ * 0.0;
                auVar193._28_4_ = 0;
                auVar203._8_4_ = 0x3f800000;
                auVar203._0_8_ = 0x3f8000003f800000;
                auVar203._12_4_ = 0x3f800000;
                auVar203._16_4_ = 0x3f800000;
                auVar203._20_4_ = 0x3f800000;
                auVar203._24_4_ = 0x3f800000;
                auVar203._28_4_ = 0x3f800000;
                auVar115 = vsubps_avx(auVar203,auVar193);
                auVar137._0_4_ =
                     (uint)(bVar88 & 1) * (int)auVar193._0_4_ |
                     (uint)!(bool)(bVar88 & 1) * auVar115._0_4_;
                bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
                auVar137._4_4_ = (uint)bVar14 * (int)auVar193._4_4_ | (uint)!bVar14 * auVar115._4_4_
                ;
                bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
                auVar137._8_4_ = (uint)bVar14 * (int)auVar193._8_4_ | (uint)!bVar14 * auVar115._8_4_
                ;
                bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                auVar137._12_4_ =
                     (uint)bVar14 * (int)auVar193._12_4_ | (uint)!bVar14 * auVar115._12_4_;
                bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                auVar137._16_4_ =
                     (uint)bVar14 * (int)auVar193._16_4_ | (uint)!bVar14 * auVar115._16_4_;
                bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
                auVar137._20_4_ =
                     (uint)bVar14 * (int)auVar193._20_4_ | (uint)!bVar14 * auVar115._20_4_;
                bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                auVar137._24_4_ =
                     (uint)bVar14 * (int)auVar193._24_4_ | (uint)!bVar14 * auVar115._24_4_;
                auVar137._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar115._28_4_;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_5e0 = vfmsub132ps_avx512vl(auVar137,auVar203,auVar34);
                local_5a0 = 0;
                auVar220 = ZEXT1664(auVar101);
                local_580 = local_840;
                uStack_578 = uStack_838;
                local_570 = local_850;
                uStack_568 = uStack_848;
                local_560 = local_860;
                uStack_558 = uStack_858;
                if ((pGVar11->mask & *(uint *)(ray + sVar96 * 4 + 0x240)) != 0) {
                  local_7a0 = SUB84(pGVar11,0);
                  uStack_79c = (undefined4)((ulong)pGVar11 >> 0x20);
                  fVar185 = 1.0 / auVar226._0_4_;
                  local_540[0] = fVar185 * (local_600._0_4_ + 0.0);
                  local_540[1] = fVar185 * (local_600._4_4_ + 1.0);
                  local_540[2] = fVar185 * (local_600._8_4_ + 2.0);
                  local_540[3] = fVar185 * (local_600._12_4_ + 3.0);
                  fStack_530 = fVar185 * (local_600._16_4_ + 4.0);
                  fStack_52c = fVar185 * (local_600._20_4_ + 5.0);
                  fStack_528 = fVar185 * (local_600._24_4_ + 6.0);
                  fStack_524 = local_600._28_4_ + 7.0;
                  local_520 = local_5e0;
                  local_500 = local_7c0;
                  auVar170._8_4_ = 0x7f800000;
                  auVar170._0_8_ = 0x7f8000007f800000;
                  auVar170._12_4_ = 0x7f800000;
                  auVar170._16_4_ = 0x7f800000;
                  auVar170._20_4_ = 0x7f800000;
                  auVar170._24_4_ = 0x7f800000;
                  auVar170._28_4_ = 0x7f800000;
                  auVar115 = vblendmps_avx512vl(auVar170,local_7c0);
                  auVar138._0_4_ =
                       (uint)(bVar97 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                  auVar138._4_4_ = (uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar98 >> 2) & 1);
                  auVar138._8_4_ = (uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar98 >> 3) & 1);
                  auVar138._12_4_ = (uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar98 >> 4) & 1);
                  auVar138._16_4_ = (uint)bVar14 * auVar115._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar98 >> 5) & 1);
                  auVar138._20_4_ = (uint)bVar14 * auVar115._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar98 >> 6) & 1);
                  auVar138._24_4_ = (uint)bVar14 * auVar115._24_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = SUB81(uVar98 >> 7,0);
                  auVar138._28_4_ = (uint)bVar14 * auVar115._28_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar115 = vshufps_avx(auVar138,auVar138,0xb1);
                  auVar115 = vminps_avx(auVar138,auVar115);
                  auVar113 = vshufpd_avx(auVar115,auVar115,5);
                  auVar115 = vminps_avx(auVar115,auVar113);
                  auVar113 = vpermpd_avx2(auVar115,0x4e);
                  auVar115 = vminps_avx(auVar115,auVar113);
                  uVar182 = vcmpps_avx512vl(auVar138,auVar115,0);
                  uVar90 = (uint)uVar98;
                  if (((byte)uVar182 & bVar97) != 0) {
                    uVar90 = (uint)((byte)uVar182 & bVar97);
                  }
                  uVar91 = 0;
                  for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                    uVar91 = uVar91 + 1;
                  }
                  uVar89 = (ulong)uVar91;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar211 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar211);
                    auVar211 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar211);
                    local_7e0 = auVar120;
                    local_5c0 = local_7c0;
                    local_59c = iVar9;
                    local_590 = auVar101;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar89]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar89 * 4)));
                      *(undefined4 *)(ray + sVar96 * 4 + 0x200) =
                           *(undefined4 *)(local_500 + uVar89 * 4);
                      local_830.context = context->user;
                      fVar181 = local_200._0_4_;
                      fVar179 = 1.0 - fVar181;
                      fVar185 = fVar179 * fVar179 * -3.0;
                      auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                                 ZEXT416((uint)(fVar181 * fVar179)),
                                                 ZEXT416(0xc0000000));
                      auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar181 * fVar179)),
                                                 ZEXT416((uint)(fVar181 * fVar181)),
                                                 ZEXT416(0x40000000));
                      fVar179 = auVar109._0_4_ * 3.0;
                      fVar180 = auVar104._0_4_ * 3.0;
                      fVar181 = fVar181 * fVar181 * 3.0;
                      auVar215._0_4_ = fVar181 * fVar196;
                      auVar215._4_4_ = fVar181 * fVar161;
                      auVar215._8_4_ = fVar181 * fVar177;
                      auVar215._12_4_ = fVar181 * fVar178;
                      auVar165._4_4_ = fVar180;
                      auVar165._0_4_ = fVar180;
                      auVar165._8_4_ = fVar180;
                      auVar165._12_4_ = fVar180;
                      auVar109 = vfmadd132ps_fma(auVar165,auVar215,auVar6);
                      auVar202._4_4_ = fVar179;
                      auVar202._0_4_ = fVar179;
                      auVar202._8_4_ = fVar179;
                      auVar202._12_4_ = fVar179;
                      auVar109 = vfmadd132ps_fma(auVar202,auVar109,auVar29);
                      auVar166._4_4_ = fVar185;
                      auVar166._0_4_ = fVar185;
                      auVar166._8_4_ = fVar185;
                      auVar166._12_4_ = fVar185;
                      auVar109 = vfmadd213ps_fma(auVar166,auVar101,auVar109);
                      auVar220 = vbroadcastss_avx512f(auVar109);
                      auVar211 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar211 = vpermps_avx512f(auVar211,ZEXT1664(auVar109));
                      auVar216 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar216,ZEXT1664(auVar109));
                      local_2c0[0] = (RTCHitN)auVar220[0];
                      local_2c0[1] = (RTCHitN)auVar220[1];
                      local_2c0[2] = (RTCHitN)auVar220[2];
                      local_2c0[3] = (RTCHitN)auVar220[3];
                      local_2c0[4] = (RTCHitN)auVar220[4];
                      local_2c0[5] = (RTCHitN)auVar220[5];
                      local_2c0[6] = (RTCHitN)auVar220[6];
                      local_2c0[7] = (RTCHitN)auVar220[7];
                      local_2c0[8] = (RTCHitN)auVar220[8];
                      local_2c0[9] = (RTCHitN)auVar220[9];
                      local_2c0[10] = (RTCHitN)auVar220[10];
                      local_2c0[0xb] = (RTCHitN)auVar220[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar220[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar220[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar220[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar220[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar220[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar220[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar220[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar220[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar220[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar220[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar220[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar220[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar220[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar220[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar220[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar220[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar220[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar220[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar220[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar220[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar220[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar220[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar220[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar220[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar220[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar220[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar220[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar220[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar220[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar220[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar220[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar220[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar220[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar220[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar220[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar220[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar220[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar220[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar220[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar220[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar220[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar220[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar220[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar220[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar220[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar220[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar220[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar220[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar220[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar220[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar220[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar220[0x3f];
                      local_280 = auVar211;
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar220 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar220);
                      auVar115 = vpcmpeqd_avx2(auVar220._0_32_,auVar220._0_32_);
                      local_7e8[3] = auVar115;
                      local_7e8[2] = auVar115;
                      local_7e8[1] = auVar115;
                      *local_7e8 = auVar115;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]));
                      auVar220 = vmovdqa64_avx512f(local_300);
                      local_740 = vmovdqa64_avx512f(auVar220);
                      local_830.valid = (int *)local_740;
                      local_830.geometryUserPtr = *(void **)(CONCAT44(uStack_79c,local_7a0) + 0x18);
                      local_830.hit = local_2c0;
                      local_830.N = 0x10;
                      pcVar13 = *(code **)(CONCAT44(uStack_79c,local_7a0) + 0x40);
                      local_760 = auVar234._0_32_;
                      local_830.ray = (RTCRayN *)ray;
                      if (pcVar13 != (code *)0x0) {
                        auVar211 = ZEXT1664(auVar211._0_16_);
                        auVar216 = ZEXT1664(auVar216._0_16_);
                        (*pcVar13)(&local_830);
                        auVar221 = ZEXT3264(local_7c0);
                        auVar234 = ZEXT3264(local_760);
                        auVar235 = ZEXT3264(local_7e0);
                        auVar237 = ZEXT464(0x35000000);
                        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar176 = ZEXT1664(auVar109);
                        auVar115 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar236 = ZEXT3264(auVar115);
                        auVar220 = vmovdqa64_avx512f(local_740);
                        sVar96 = local_7f0;
                      }
                      uVar182 = vptestmd_avx512f(auVar220,auVar220);
                      if ((short)uVar182 == 0) {
LAB_01c8c881:
                        *(int *)(ray + sVar96 * 4 + 0x200) = auVar234._0_4_;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(CONCAT44(uStack_79c,local_7a0) + 0x3e) & 0x40) != 0)))) {
                          auVar211 = ZEXT1664(auVar211._0_16_);
                          auVar216 = ZEXT1664(auVar216._0_16_);
                          (*p_Var12)(&local_830);
                          auVar221 = ZEXT3264(local_7c0);
                          auVar234 = ZEXT3264(local_760);
                          auVar235 = ZEXT3264(local_7e0);
                          auVar237 = ZEXT464(0x35000000);
                          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar176 = ZEXT1664(auVar109);
                          auVar115 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar236 = ZEXT3264(auVar115);
                          auVar220 = vmovdqa64_avx512f(local_740);
                          sVar96 = local_7f0;
                        }
                        uVar92 = vptestmd_avx512f(auVar220,auVar220);
                        if ((short)uVar92 == 0) goto LAB_01c8c881;
                        iVar1 = *(int *)(local_830.hit + 4);
                        iVar2 = *(int *)(local_830.hit + 8);
                        iVar74 = *(int *)(local_830.hit + 0xc);
                        iVar75 = *(int *)(local_830.hit + 0x10);
                        iVar76 = *(int *)(local_830.hit + 0x14);
                        iVar77 = *(int *)(local_830.hit + 0x18);
                        iVar78 = *(int *)(local_830.hit + 0x1c);
                        iVar79 = *(int *)(local_830.hit + 0x20);
                        iVar80 = *(int *)(local_830.hit + 0x24);
                        iVar81 = *(int *)(local_830.hit + 0x28);
                        iVar82 = *(int *)(local_830.hit + 0x2c);
                        iVar83 = *(int *)(local_830.hit + 0x30);
                        iVar84 = *(int *)(local_830.hit + 0x34);
                        iVar85 = *(int *)(local_830.hit + 0x38);
                        iVar86 = *(int *)(local_830.hit + 0x3c);
                        bVar97 = (byte)uVar92;
                        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar88 = (byte)(uVar92 >> 8);
                        bVar22 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar28 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x300) =
                             (uint)(bVar97 & 1) * *(int *)local_830.hit |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_830.ray + 0x300);
                        *(uint *)(local_830.ray + 0x304) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x304);
                        *(uint *)(local_830.ray + 0x308) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x308);
                        *(uint *)(local_830.ray + 0x30c) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_830.ray + 0x30c)
                        ;
                        *(uint *)(local_830.ray + 0x310) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_830.ray + 0x310)
                        ;
                        *(uint *)(local_830.ray + 0x314) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_830.ray + 0x314)
                        ;
                        *(uint *)(local_830.ray + 0x318) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x318)
                        ;
                        *(uint *)(local_830.ray + 0x31c) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x31c)
                        ;
                        *(uint *)(local_830.ray + 800) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 800);
                        *(uint *)(local_830.ray + 0x324) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x324)
                        ;
                        *(uint *)(local_830.ray + 0x328) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x328)
                        ;
                        *(uint *)(local_830.ray + 0x32c) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x32c)
                        ;
                        *(uint *)(local_830.ray + 0x330) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x330)
                        ;
                        *(uint *)(local_830.ray + 0x334) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x334)
                        ;
                        *(uint *)(local_830.ray + 0x338) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_830.ray + 0x338)
                        ;
                        *(uint *)(local_830.ray + 0x33c) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_830.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0x44);
                        iVar2 = *(int *)(local_830.hit + 0x48);
                        iVar74 = *(int *)(local_830.hit + 0x4c);
                        iVar75 = *(int *)(local_830.hit + 0x50);
                        iVar76 = *(int *)(local_830.hit + 0x54);
                        iVar77 = *(int *)(local_830.hit + 0x58);
                        iVar78 = *(int *)(local_830.hit + 0x5c);
                        iVar79 = *(int *)(local_830.hit + 0x60);
                        iVar80 = *(int *)(local_830.hit + 100);
                        iVar81 = *(int *)(local_830.hit + 0x68);
                        iVar82 = *(int *)(local_830.hit + 0x6c);
                        iVar83 = *(int *)(local_830.hit + 0x70);
                        iVar84 = *(int *)(local_830.hit + 0x74);
                        iVar85 = *(int *)(local_830.hit + 0x78);
                        iVar86 = *(int *)(local_830.hit + 0x7c);
                        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar28 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x340) =
                             (uint)(bVar97 & 1) * *(int *)(local_830.hit + 0x40) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_830.ray + 0x340);
                        *(uint *)(local_830.ray + 0x344) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x344);
                        *(uint *)(local_830.ray + 0x348) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x348);
                        *(uint *)(local_830.ray + 0x34c) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_830.ray + 0x34c)
                        ;
                        *(uint *)(local_830.ray + 0x350) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_830.ray + 0x350)
                        ;
                        *(uint *)(local_830.ray + 0x354) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_830.ray + 0x354)
                        ;
                        *(uint *)(local_830.ray + 0x358) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x358)
                        ;
                        *(uint *)(local_830.ray + 0x35c) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x35c)
                        ;
                        *(uint *)(local_830.ray + 0x360) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x360);
                        *(uint *)(local_830.ray + 0x364) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x364)
                        ;
                        *(uint *)(local_830.ray + 0x368) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x368)
                        ;
                        *(uint *)(local_830.ray + 0x36c) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x36c)
                        ;
                        *(uint *)(local_830.ray + 0x370) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x370)
                        ;
                        *(uint *)(local_830.ray + 0x374) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x374)
                        ;
                        *(uint *)(local_830.ray + 0x378) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_830.ray + 0x378)
                        ;
                        *(uint *)(local_830.ray + 0x37c) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_830.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0x84);
                        iVar2 = *(int *)(local_830.hit + 0x88);
                        iVar74 = *(int *)(local_830.hit + 0x8c);
                        iVar75 = *(int *)(local_830.hit + 0x90);
                        iVar76 = *(int *)(local_830.hit + 0x94);
                        iVar77 = *(int *)(local_830.hit + 0x98);
                        iVar78 = *(int *)(local_830.hit + 0x9c);
                        iVar79 = *(int *)(local_830.hit + 0xa0);
                        iVar80 = *(int *)(local_830.hit + 0xa4);
                        iVar81 = *(int *)(local_830.hit + 0xa8);
                        iVar82 = *(int *)(local_830.hit + 0xac);
                        iVar83 = *(int *)(local_830.hit + 0xb0);
                        iVar84 = *(int *)(local_830.hit + 0xb4);
                        iVar85 = *(int *)(local_830.hit + 0xb8);
                        iVar86 = *(int *)(local_830.hit + 0xbc);
                        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar28 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x380) =
                             (uint)(bVar97 & 1) * *(int *)(local_830.hit + 0x80) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_830.ray + 0x380);
                        *(uint *)(local_830.ray + 900) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 900);
                        *(uint *)(local_830.ray + 0x388) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x388);
                        *(uint *)(local_830.ray + 0x38c) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_830.ray + 0x38c)
                        ;
                        *(uint *)(local_830.ray + 0x390) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_830.ray + 0x390)
                        ;
                        *(uint *)(local_830.ray + 0x394) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_830.ray + 0x394)
                        ;
                        *(uint *)(local_830.ray + 0x398) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x398)
                        ;
                        *(uint *)(local_830.ray + 0x39c) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x39c)
                        ;
                        *(uint *)(local_830.ray + 0x3a0) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x3a0);
                        *(uint *)(local_830.ray + 0x3a4) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3a4)
                        ;
                        *(uint *)(local_830.ray + 0x3a8) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3a8)
                        ;
                        *(uint *)(local_830.ray + 0x3ac) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3ac)
                        ;
                        *(uint *)(local_830.ray + 0x3b0) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3b0)
                        ;
                        *(uint *)(local_830.ray + 0x3b4) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3b4)
                        ;
                        *(uint *)(local_830.ray + 0x3b8) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_830.ray + 0x3b8)
                        ;
                        *(uint *)(local_830.ray + 0x3bc) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_830.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0xc4);
                        iVar2 = *(int *)(local_830.hit + 200);
                        iVar74 = *(int *)(local_830.hit + 0xcc);
                        iVar75 = *(int *)(local_830.hit + 0xd0);
                        iVar76 = *(int *)(local_830.hit + 0xd4);
                        iVar77 = *(int *)(local_830.hit + 0xd8);
                        iVar78 = *(int *)(local_830.hit + 0xdc);
                        iVar79 = *(int *)(local_830.hit + 0xe0);
                        iVar80 = *(int *)(local_830.hit + 0xe4);
                        iVar81 = *(int *)(local_830.hit + 0xe8);
                        iVar82 = *(int *)(local_830.hit + 0xec);
                        iVar83 = *(int *)(local_830.hit + 0xf0);
                        iVar84 = *(int *)(local_830.hit + 0xf4);
                        iVar85 = *(int *)(local_830.hit + 0xf8);
                        iVar86 = *(int *)(local_830.hit + 0xfc);
                        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar28 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x3c0) =
                             (uint)(bVar97 & 1) * *(int *)(local_830.hit + 0xc0) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_830.ray + 0x3c0);
                        *(uint *)(local_830.ray + 0x3c4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x3c4);
                        *(uint *)(local_830.ray + 0x3c8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x3c8);
                        *(uint *)(local_830.ray + 0x3cc) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_830.ray + 0x3cc)
                        ;
                        *(uint *)(local_830.ray + 0x3d0) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_830.ray + 0x3d0)
                        ;
                        *(uint *)(local_830.ray + 0x3d4) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_830.ray + 0x3d4)
                        ;
                        *(uint *)(local_830.ray + 0x3d8) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x3d8)
                        ;
                        *(uint *)(local_830.ray + 0x3dc) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3dc)
                        ;
                        *(uint *)(local_830.ray + 0x3e0) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x3e0);
                        *(uint *)(local_830.ray + 0x3e4) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3e4)
                        ;
                        *(uint *)(local_830.ray + 1000) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 1000);
                        *(uint *)(local_830.ray + 0x3ec) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3ec)
                        ;
                        *(uint *)(local_830.ray + 0x3f0) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3f0)
                        ;
                        *(uint *)(local_830.ray + 0x3f4) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x3f4)
                        ;
                        *(uint *)(local_830.ray + 0x3f8) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_830.ray + 0x3f8)
                        ;
                        *(uint *)(local_830.ray + 0x3fc) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_830.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_830.hit + 0x104);
                        iVar2 = *(int *)(local_830.hit + 0x108);
                        iVar74 = *(int *)(local_830.hit + 0x10c);
                        iVar75 = *(int *)(local_830.hit + 0x110);
                        iVar76 = *(int *)(local_830.hit + 0x114);
                        iVar77 = *(int *)(local_830.hit + 0x118);
                        iVar78 = *(int *)(local_830.hit + 0x11c);
                        iVar79 = *(int *)(local_830.hit + 0x120);
                        iVar80 = *(int *)(local_830.hit + 0x124);
                        iVar81 = *(int *)(local_830.hit + 0x128);
                        iVar82 = *(int *)(local_830.hit + 300);
                        iVar83 = *(int *)(local_830.hit + 0x130);
                        iVar84 = *(int *)(local_830.hit + 0x134);
                        iVar85 = *(int *)(local_830.hit + 0x138);
                        iVar86 = *(int *)(local_830.hit + 0x13c);
                        bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar24 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar25 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar26 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar27 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar28 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_830.ray + 0x400) =
                             (uint)(bVar97 & 1) * *(int *)(local_830.hit + 0x100) |
                             (uint)!(bool)(bVar97 & 1) * *(int *)(local_830.ray + 0x400);
                        *(uint *)(local_830.ray + 0x404) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 0x404);
                        *(uint *)(local_830.ray + 0x408) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_830.ray + 0x408);
                        *(uint *)(local_830.ray + 0x40c) =
                             (uint)bVar16 * iVar74 | (uint)!bVar16 * *(int *)(local_830.ray + 0x40c)
                        ;
                        *(uint *)(local_830.ray + 0x410) =
                             (uint)bVar17 * iVar75 | (uint)!bVar17 * *(int *)(local_830.ray + 0x410)
                        ;
                        *(uint *)(local_830.ray + 0x414) =
                             (uint)bVar18 * iVar76 | (uint)!bVar18 * *(int *)(local_830.ray + 0x414)
                        ;
                        *(uint *)(local_830.ray + 0x418) =
                             (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x418)
                        ;
                        *(uint *)(local_830.ray + 0x41c) =
                             (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x41c)
                        ;
                        *(uint *)(local_830.ray + 0x420) =
                             (uint)(bVar88 & 1) * iVar79 |
                             (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x420);
                        *(uint *)(local_830.ray + 0x424) =
                             (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x424)
                        ;
                        *(uint *)(local_830.ray + 0x428) =
                             (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x428)
                        ;
                        *(uint *)(local_830.ray + 0x42c) =
                             (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x42c)
                        ;
                        *(uint *)(local_830.ray + 0x430) =
                             (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x430)
                        ;
                        *(uint *)(local_830.ray + 0x434) =
                             (uint)bVar26 * iVar84 | (uint)!bVar26 * *(int *)(local_830.ray + 0x434)
                        ;
                        *(uint *)(local_830.ray + 0x438) =
                             (uint)bVar27 * iVar85 | (uint)!bVar27 * *(int *)(local_830.ray + 0x438)
                        ;
                        *(uint *)(local_830.ray + 0x43c) =
                             (uint)bVar28 * iVar86 | (uint)!bVar28 * *(int *)(local_830.ray + 0x43c)
                        ;
                        auVar220 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140));
                        auVar220 = vmovdqu32_avx512f(auVar220);
                        *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar220;
                        auVar220 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180));
                        auVar220 = vmovdqu32_avx512f(auVar220);
                        *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar220;
                        auVar220 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0));
                        auVar220 = vmovdqa32_avx512f(auVar220);
                        *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar220;
                        auVar220 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200));
                        auVar220 = vmovdqa32_avx512f(auVar220);
                        *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar220;
                        auVar234 = ZEXT464(*(uint *)(ray + sVar96 * 4 + 0x200));
                      }
                      auVar120 = auVar235._0_32_;
                      bVar97 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & (byte)uVar98;
                      uVar162 = auVar234._0_4_;
                      auVar174._4_4_ = uVar162;
                      auVar174._0_4_ = uVar162;
                      auVar174._8_4_ = uVar162;
                      auVar174._12_4_ = uVar162;
                      auVar174._16_4_ = uVar162;
                      auVar174._20_4_ = uVar162;
                      auVar174._24_4_ = uVar162;
                      auVar174._28_4_ = uVar162;
                      uVar182 = vcmpps_avx512vl(auVar221._0_32_,auVar174,2);
                      if ((bVar97 & (byte)uVar182) == 0) goto LAB_01c8b6ee;
                      bVar97 = bVar97 & (byte)uVar182;
                      uVar98 = (ulong)bVar97;
                      auVar175._8_4_ = 0x7f800000;
                      auVar175._0_8_ = 0x7f8000007f800000;
                      auVar175._12_4_ = 0x7f800000;
                      auVar175._16_4_ = 0x7f800000;
                      auVar175._20_4_ = 0x7f800000;
                      auVar175._24_4_ = 0x7f800000;
                      auVar175._28_4_ = 0x7f800000;
                      auVar115 = vblendmps_avx512vl(auVar175,auVar221._0_32_);
                      auVar151._0_4_ =
                           (uint)(bVar97 & 1) * auVar115._0_4_ |
                           (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                      bVar14 = (bool)(bVar97 >> 1 & 1);
                      auVar151._4_4_ = (uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar97 >> 2 & 1);
                      auVar151._8_4_ = (uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar97 >> 3 & 1);
                      auVar151._12_4_ = (uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar97 >> 4 & 1);
                      auVar151._16_4_ = (uint)bVar14 * auVar115._16_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar97 >> 5 & 1);
                      auVar151._20_4_ = (uint)bVar14 * auVar115._20_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar97 >> 6 & 1);
                      auVar151._24_4_ = (uint)bVar14 * auVar115._24_4_ | (uint)!bVar14 * 0x7f800000;
                      auVar151._28_4_ =
                           (uint)(bVar97 >> 7) * auVar115._28_4_ |
                           (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                      auVar115 = vshufps_avx(auVar151,auVar151,0xb1);
                      auVar115 = vminps_avx(auVar151,auVar115);
                      auVar113 = vshufpd_avx(auVar115,auVar115,5);
                      auVar115 = vminps_avx(auVar115,auVar113);
                      auVar113 = vpermpd_avx2(auVar115,0x4e);
                      auVar115 = vminps_avx(auVar115,auVar113);
                      uVar182 = vcmpps_avx512vl(auVar151,auVar115,0);
                      bVar88 = (byte)uVar182 & bVar97;
                      if (bVar88 != 0) {
                        bVar97 = bVar88;
                      }
                      uVar90 = 0;
                      for (uVar91 = (uint)bVar97; (uVar91 & 1) == 0;
                          uVar91 = uVar91 >> 1 | 0x80000000) {
                        uVar90 = uVar90 + 1;
                      }
                      uVar89 = (ulong)uVar90;
                    } while( true );
                  }
                  fVar185 = local_540[uVar89];
                  uVar162 = *(undefined4 *)(local_520 + uVar89 * 4);
                  fVar180 = 1.0 - fVar185;
                  fVar179 = fVar180 * fVar180 * -3.0;
                  auVar211 = ZEXT464((uint)fVar179);
                  auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * fVar180)),
                                             ZEXT416((uint)(fVar185 * fVar180)),ZEXT416(0xc0000000))
                  ;
                  auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar180)),
                                             ZEXT416((uint)(fVar185 * fVar185)),ZEXT416(0x40000000))
                  ;
                  fVar180 = auVar109._0_4_ * 3.0;
                  fVar181 = auVar104._0_4_ * 3.0;
                  fVar195 = fVar185 * fVar185 * 3.0;
                  auVar212._0_4_ = fVar195 * fVar196;
                  auVar212._4_4_ = fVar195 * fVar161;
                  auVar212._8_4_ = fVar195 * fVar177;
                  auVar212._12_4_ = fVar195 * fVar178;
                  auVar216 = ZEXT1664(auVar212);
                  auVar188._4_4_ = fVar181;
                  auVar188._0_4_ = fVar181;
                  auVar188._8_4_ = fVar181;
                  auVar188._12_4_ = fVar181;
                  auVar109 = vfmadd132ps_fma(auVar188,auVar212,auVar6);
                  auVar199._4_4_ = fVar180;
                  auVar199._0_4_ = fVar180;
                  auVar199._8_4_ = fVar180;
                  auVar199._12_4_ = fVar180;
                  auVar109 = vfmadd132ps_fma(auVar199,auVar109,auVar29);
                  auVar189._4_4_ = fVar179;
                  auVar189._0_4_ = fVar179;
                  auVar189._8_4_ = fVar179;
                  auVar189._12_4_ = fVar179;
                  auVar109 = vfmadd213ps_fma(auVar189,auVar101,auVar109);
                  *(undefined4 *)(ray + sVar96 * 4 + 0x200) =
                       *(undefined4 *)(local_500 + uVar89 * 4);
                  *(int *)(ray + sVar96 * 4 + 0x300) = auVar109._0_4_;
                  uVar10 = vextractps_avx(auVar109,1);
                  *(undefined4 *)(ray + sVar96 * 4 + 0x340) = uVar10;
                  uVar10 = vextractps_avx(auVar109,2);
                  *(undefined4 *)(ray + sVar96 * 4 + 0x380) = uVar10;
                  *(float *)(ray + sVar96 * 4 + 0x3c0) = fVar185;
                  *(undefined4 *)(ray + sVar96 * 4 + 0x400) = uVar162;
                  *(undefined4 *)(ray + sVar96 * 4 + 0x440) = uVar3;
                  *(uint *)(ray + sVar96 * 4 + 0x480) = uVar94;
                  *(uint *)(ray + sVar96 * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + sVar96 * 4 + 0x500) = context->user->instPrimID[0];
LAB_01c8b6ee:
                  auVar220 = ZEXT1664(auVar101);
                }
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        auVar115 = vpbroadcastd_avx512vl();
        auVar221 = ZEXT3264(auVar115);
        local_7a0 = local_880;
        uStack_79c = local_880;
        uStack_798 = local_880;
        uStack_794 = local_880;
        uStack_790 = local_880;
        uStack_78c = local_880;
        uStack_788 = local_880;
        uStack_784 = local_880;
        local_760._4_4_ = local_780._0_4_;
        local_760._0_4_ = local_780._0_4_;
        local_760._8_4_ = local_780._0_4_;
        local_760._12_4_ = local_780._0_4_;
        local_760._16_4_ = local_780._0_4_;
        local_760._20_4_ = local_780._0_4_;
        local_760._24_4_ = local_780._0_4_;
        local_760._28_4_ = local_780._0_4_;
        local_3c0 = 1.0 / (float)local_800._0_4_;
        fStack_3bc = local_3c0;
        fStack_3b8 = local_3c0;
        fStack_3b4 = local_3c0;
        fStack_3b0 = local_3c0;
        fStack_3ac = local_3c0;
        fStack_3a8 = local_3c0;
        fStack_3a4 = local_3c0;
        auVar235 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar235);
        auVar235 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar235);
        lVar93 = 8;
        local_7e0 = auVar120;
LAB_01c8b7b3:
        auVar115 = vpbroadcastd_avx512vl();
        auVar115 = vpor_avx2(auVar115,_DAT_01fe9900);
        uVar30 = vpcmpgtd_avx512vl(auVar221._0_32_,auVar115);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar93 * 4 + lVar31);
        auVar113 = *(undefined1 (*) [32])(lVar31 + 0x21aa768 + lVar93 * 4);
        auVar125 = *(undefined1 (*) [32])(lVar31 + 0x21aabec + lVar93 * 4);
        auVar124 = *(undefined1 (*) [32])(lVar31 + 0x21ab070 + lVar93 * 4);
        auVar235._0_4_ = auVar124._0_4_ * (float)local_6e0._0_4_;
        auVar235._4_4_ = auVar124._4_4_ * (float)local_6e0._4_4_;
        auVar235._8_4_ = auVar124._8_4_ * fStack_6d8;
        auVar235._12_4_ = auVar124._12_4_ * fStack_6d4;
        auVar235._16_4_ = auVar124._16_4_ * fStack_6d0;
        auVar235._20_4_ = auVar124._20_4_ * fStack_6cc;
        auVar235._28_36_ = auVar216._28_36_;
        auVar235._24_4_ = auVar124._24_4_ * fStack_6c8;
        auVar216._0_4_ = auVar124._0_4_ * (float)local_700._0_4_;
        auVar216._4_4_ = auVar124._4_4_ * (float)local_700._4_4_;
        auVar216._8_4_ = auVar124._8_4_ * fStack_6f8;
        auVar216._12_4_ = auVar124._12_4_ * fStack_6f4;
        auVar216._16_4_ = auVar124._16_4_ * fStack_6f0;
        auVar216._20_4_ = auVar124._20_4_ * fStack_6ec;
        auVar216._28_36_ = auVar211._28_36_;
        auVar216._24_4_ = auVar124._24_4_ * fStack_6e8;
        auVar116 = vmulps_avx512vl(local_3a0,auVar124);
        auVar114 = vfmadd231ps_avx512vl(auVar235._0_32_,auVar125,local_6a0);
        auVar123 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar125,local_6c0);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar125,local_380);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar113,local_660);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar113,local_680);
        auVar122 = vfmadd231ps_avx512vl(auVar116,auVar113,local_360);
        auVar109 = vfmadd231ps_fma(auVar114,auVar115,local_620);
        auVar216 = ZEXT1664(auVar109);
        auVar104 = vfmadd231ps_fma(auVar123,auVar115,local_640);
        auVar211 = ZEXT1664(auVar104);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar93 * 4 + lVar31);
        auVar114 = *(undefined1 (*) [32])(lVar31 + 0x21acb88 + lVar93 * 4);
        auVar112 = vfmadd231ps_avx512vl(auVar122,auVar115,local_340);
        auVar123 = *(undefined1 (*) [32])(lVar31 + 0x21ad00c + lVar93 * 4);
        auVar122 = *(undefined1 (*) [32])(lVar31 + 0x21ad490 + lVar93 * 4);
        auVar234._0_4_ = auVar122._0_4_ * (float)local_6e0._0_4_;
        auVar234._4_4_ = auVar122._4_4_ * (float)local_6e0._4_4_;
        auVar234._8_4_ = auVar122._8_4_ * fStack_6d8;
        auVar234._12_4_ = auVar122._12_4_ * fStack_6d4;
        auVar234._16_4_ = auVar122._16_4_ * fStack_6d0;
        auVar234._20_4_ = auVar122._20_4_ * fStack_6cc;
        auVar234._28_36_ = auVar220._28_36_;
        auVar234._24_4_ = auVar122._24_4_ * fStack_6c8;
        auVar56._4_4_ = auVar122._4_4_ * (float)local_700._4_4_;
        auVar56._0_4_ = auVar122._0_4_ * (float)local_700._0_4_;
        auVar56._8_4_ = auVar122._8_4_ * fStack_6f8;
        auVar56._12_4_ = auVar122._12_4_ * fStack_6f4;
        auVar56._16_4_ = auVar122._16_4_ * fStack_6f0;
        auVar56._20_4_ = auVar122._20_4_ * fStack_6ec;
        auVar56._24_4_ = auVar122._24_4_ * fStack_6e8;
        auVar56._28_4_ = uStack_6e4;
        auVar117 = vmulps_avx512vl(local_3a0,auVar122);
        auVar118 = vfmadd231ps_avx512vl(auVar234._0_32_,auVar123,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar56,auVar123,local_6c0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar123,local_380);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,local_660);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar114,local_680);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,local_360);
        auVar105 = vfmadd231ps_fma(auVar118,auVar116,local_620);
        auVar220 = ZEXT1664(auVar105);
        auVar103 = vfmadd231ps_fma(auVar119,auVar116,local_640);
        auVar119 = vfmadd231ps_avx512vl(auVar117,auVar116,local_340);
        auVar120 = vmaxps_avx512vl(auVar112,auVar119);
        auVar117 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar109));
        auVar118 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar104));
        auVar110 = vmulps_avx512vl(ZEXT1632(auVar104),auVar117);
        auVar111 = vmulps_avx512vl(ZEXT1632(auVar109),auVar118);
        auVar110 = vsubps_avx512vl(auVar110,auVar111);
        auVar111 = vmulps_avx512vl(auVar118,auVar118);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,auVar117);
        auVar120 = vmulps_avx512vl(auVar120,auVar120);
        auVar120 = vmulps_avx512vl(auVar120,auVar111);
        auVar110 = vmulps_avx512vl(auVar110,auVar110);
        uVar182 = vcmpps_avx512vl(auVar110,auVar120,2);
        bVar97 = (byte)uVar30 & (byte)uVar182;
        if (bVar97 != 0) {
          auVar122 = vmulps_avx512vl(local_4e0,auVar122);
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_4c0,auVar122);
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_4a0,auVar123);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_7e0,auVar114);
          auVar124 = vmulps_avx512vl(local_4e0,auVar124);
          auVar125 = vfmadd213ps_avx512vl(auVar125,local_4c0,auVar124);
          auVar113 = vfmadd213ps_avx512vl(auVar113,local_4a0,auVar125);
          auVar114 = vfmadd213ps_avx512vl(auVar115,local_7e0,auVar113);
          auVar115 = *(undefined1 (*) [32])(lVar31 + 0x21ab4f4 + lVar93 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar31 + 0x21ab978 + lVar93 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar31 + 0x21abdfc + lVar93 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar31 + 0x21ac280 + lVar93 * 4);
          auVar123 = vmulps_avx512vl(_local_6e0,auVar124);
          auVar122 = vmulps_avx512vl(_local_700,auVar124);
          auVar124 = vmulps_avx512vl(local_4e0,auVar124);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,local_6a0);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar125,local_6c0);
          auVar125 = vfmadd231ps_avx512vl(auVar124,local_4c0,auVar125);
          auVar124 = vfmadd231ps_avx512vl(auVar123,auVar113,local_660);
          auVar123 = vfmadd231ps_avx512vl(auVar122,auVar113,local_680);
          auVar113 = vfmadd231ps_avx512vl(auVar125,local_4a0,auVar113);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar115,local_620);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar115,local_640);
          auVar102 = vfmadd231ps_fma(auVar113,auVar115,local_7e0);
          auVar115 = *(undefined1 (*) [32])(lVar31 + 0x21ad914 + lVar93 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar31 + 0x21ae21c + lVar93 * 4);
          auVar125 = *(undefined1 (*) [32])(lVar31 + 0x21ae6a0 + lVar93 * 4);
          auVar122 = vmulps_avx512vl(_local_6e0,auVar125);
          auVar120 = vmulps_avx512vl(_local_700,auVar125);
          auVar125 = vmulps_avx512vl(local_4e0,auVar125);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,local_6a0);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar113,local_6c0);
          auVar125 = vfmadd231ps_avx512vl(auVar125,local_4c0,auVar113);
          auVar113 = *(undefined1 (*) [32])(lVar31 + 0x21add98 + lVar93 * 4);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,local_660);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar113,local_680);
          auVar113 = vfmadd231ps_avx512vl(auVar125,local_4a0,auVar113);
          auVar125 = vfmadd231ps_avx512vl(auVar122,auVar115,local_620);
          auVar122 = vfmadd231ps_avx512vl(auVar120,auVar115,local_640);
          auVar113 = vfmadd231ps_avx512vl(auVar113,local_7e0,auVar115);
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar124,auVar120);
          vandps_avx512vl(auVar123,auVar120);
          auVar115 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(ZEXT1632(auVar102),auVar120);
          auVar115 = vmaxps_avx(auVar115,auVar120);
          auVar87._4_4_ = uStack_79c;
          auVar87._0_4_ = local_7a0;
          auVar87._8_4_ = uStack_798;
          auVar87._12_4_ = uStack_794;
          auVar87._16_4_ = uStack_790;
          auVar87._20_4_ = uStack_78c;
          auVar87._24_4_ = uStack_788;
          auVar87._28_4_ = uStack_784;
          uVar89 = vcmpps_avx512vl(auVar115,auVar87,1);
          bVar14 = (bool)((byte)uVar89 & 1);
          auVar139._0_4_ = (float)((uint)bVar14 * auVar117._0_4_ | (uint)!bVar14 * auVar124._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar139._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar124._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar139._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar124._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar139._12_4_ =
               (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar124._12_4_);
          bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar139._16_4_ =
               (float)((uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * auVar124._16_4_);
          bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar139._20_4_ =
               (float)((uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * auVar124._20_4_);
          bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar139._24_4_ =
               (float)((uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * auVar124._24_4_);
          bVar14 = SUB81(uVar89 >> 7,0);
          auVar139._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * auVar124._28_4_;
          bVar14 = (bool)((byte)uVar89 & 1);
          auVar140._0_4_ = (float)((uint)bVar14 * auVar118._0_4_ | (uint)!bVar14 * auVar123._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar14 * auVar118._4_4_ | (uint)!bVar14 * auVar123._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar14 * auVar118._8_4_ | (uint)!bVar14 * auVar123._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar14 * auVar118._12_4_ | (uint)!bVar14 * auVar123._12_4_);
          bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar140._16_4_ =
               (float)((uint)bVar14 * auVar118._16_4_ | (uint)!bVar14 * auVar123._16_4_);
          bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar140._20_4_ =
               (float)((uint)bVar14 * auVar118._20_4_ | (uint)!bVar14 * auVar123._20_4_);
          bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar140._24_4_ =
               (float)((uint)bVar14 * auVar118._24_4_ | (uint)!bVar14 * auVar123._24_4_);
          bVar14 = SUB81(uVar89 >> 7,0);
          auVar140._28_4_ = (uint)bVar14 * auVar118._28_4_ | (uint)!bVar14 * auVar123._28_4_;
          vandps_avx512vl(auVar125,auVar120);
          vandps_avx512vl(auVar122,auVar120);
          auVar115 = vmaxps_avx(auVar140,auVar140);
          vandps_avx512vl(auVar113,auVar120);
          auVar115 = vmaxps_avx(auVar115,auVar140);
          uVar89 = vcmpps_avx512vl(auVar115,auVar87,1);
          bVar14 = (bool)((byte)uVar89 & 1);
          auVar141._0_4_ = (uint)bVar14 * auVar117._0_4_ | (uint)!bVar14 * auVar125._0_4_;
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar141._4_4_ = (uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar125._4_4_;
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar141._8_4_ = (uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar125._8_4_;
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar141._12_4_ = (uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar125._12_4_;
          bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar141._16_4_ = (uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * auVar125._16_4_;
          bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar141._20_4_ = (uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * auVar125._20_4_;
          bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar141._24_4_ = (uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * auVar125._24_4_;
          bVar14 = SUB81(uVar89 >> 7,0);
          auVar141._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * auVar125._28_4_;
          bVar14 = (bool)((byte)uVar89 & 1);
          auVar142._0_4_ = (float)((uint)bVar14 * auVar118._0_4_ | (uint)!bVar14 * auVar122._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar142._4_4_ = (float)((uint)bVar14 * auVar118._4_4_ | (uint)!bVar14 * auVar122._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar142._8_4_ = (float)((uint)bVar14 * auVar118._8_4_ | (uint)!bVar14 * auVar122._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar142._12_4_ =
               (float)((uint)bVar14 * auVar118._12_4_ | (uint)!bVar14 * auVar122._12_4_);
          bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar142._16_4_ =
               (float)((uint)bVar14 * auVar118._16_4_ | (uint)!bVar14 * auVar122._16_4_);
          bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar142._20_4_ =
               (float)((uint)bVar14 * auVar118._20_4_ | (uint)!bVar14 * auVar122._20_4_);
          bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar142._24_4_ =
               (float)((uint)bVar14 * auVar118._24_4_ | (uint)!bVar14 * auVar122._24_4_);
          bVar14 = SUB81(uVar89 >> 7,0);
          auVar142._28_4_ = (uint)bVar14 * auVar118._28_4_ | (uint)!bVar14 * auVar122._28_4_;
          auVar224._8_4_ = 0x80000000;
          auVar224._0_8_ = 0x8000000080000000;
          auVar224._12_4_ = 0x80000000;
          auVar224._16_4_ = 0x80000000;
          auVar224._20_4_ = 0x80000000;
          auVar224._24_4_ = 0x80000000;
          auVar224._28_4_ = 0x80000000;
          auVar115 = vxorps_avx512vl(auVar141,auVar224);
          auVar108 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
          auVar113 = vfmadd213ps_avx512vl(auVar139,auVar139,ZEXT1632(auVar108));
          auVar102 = vfmadd231ps_fma(auVar113,auVar140,auVar140);
          auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
          auVar232._8_4_ = 0xbf000000;
          auVar232._0_8_ = 0xbf000000bf000000;
          auVar232._12_4_ = 0xbf000000;
          auVar232._16_4_ = 0xbf000000;
          auVar232._20_4_ = 0xbf000000;
          auVar232._24_4_ = 0xbf000000;
          auVar232._28_4_ = 0xbf000000;
          fVar185 = auVar113._0_4_;
          fVar179 = auVar113._4_4_;
          fVar180 = auVar113._8_4_;
          fVar181 = auVar113._12_4_;
          fVar195 = auVar113._16_4_;
          fVar206 = auVar113._20_4_;
          fVar99 = auVar113._24_4_;
          auVar57._4_4_ = fVar179 * fVar179 * fVar179 * auVar102._4_4_ * -0.5;
          auVar57._0_4_ = fVar185 * fVar185 * fVar185 * auVar102._0_4_ * -0.5;
          auVar57._8_4_ = fVar180 * fVar180 * fVar180 * auVar102._8_4_ * -0.5;
          auVar57._12_4_ = fVar181 * fVar181 * fVar181 * auVar102._12_4_ * -0.5;
          auVar57._16_4_ = fVar195 * fVar195 * fVar195 * -0.0;
          auVar57._20_4_ = fVar206 * fVar206 * fVar206 * -0.0;
          auVar57._24_4_ = fVar99 * fVar99 * fVar99 * -0.0;
          auVar57._28_4_ = auVar140._28_4_;
          auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar113 = vfmadd231ps_avx512vl(auVar57,auVar125,auVar113);
          auVar58._4_4_ = auVar140._4_4_ * auVar113._4_4_;
          auVar58._0_4_ = auVar140._0_4_ * auVar113._0_4_;
          auVar58._8_4_ = auVar140._8_4_ * auVar113._8_4_;
          auVar58._12_4_ = auVar140._12_4_ * auVar113._12_4_;
          auVar58._16_4_ = auVar140._16_4_ * auVar113._16_4_;
          auVar58._20_4_ = auVar140._20_4_ * auVar113._20_4_;
          auVar58._24_4_ = auVar140._24_4_ * auVar113._24_4_;
          auVar58._28_4_ = 0;
          auVar59._4_4_ = auVar113._4_4_ * -auVar139._4_4_;
          auVar59._0_4_ = auVar113._0_4_ * -auVar139._0_4_;
          auVar59._8_4_ = auVar113._8_4_ * -auVar139._8_4_;
          auVar59._12_4_ = auVar113._12_4_ * -auVar139._12_4_;
          auVar59._16_4_ = auVar113._16_4_ * -auVar139._16_4_;
          auVar59._20_4_ = auVar113._20_4_ * -auVar139._20_4_;
          auVar59._24_4_ = auVar113._24_4_ * -auVar139._24_4_;
          auVar59._28_4_ = auVar140._28_4_;
          auVar124 = vmulps_avx512vl(auVar113,ZEXT1632(auVar108));
          auVar122 = ZEXT1632(auVar108);
          auVar113 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar122);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar142,auVar142);
          auVar123 = vrsqrt14ps_avx512vl(auVar113);
          auVar113 = vmulps_avx512vl(auVar113,auVar232);
          fVar185 = auVar123._0_4_;
          fVar179 = auVar123._4_4_;
          fVar180 = auVar123._8_4_;
          fVar181 = auVar123._12_4_;
          fVar195 = auVar123._16_4_;
          fVar206 = auVar123._20_4_;
          fVar99 = auVar123._24_4_;
          auVar60._4_4_ = fVar179 * fVar179 * fVar179 * auVar113._4_4_;
          auVar60._0_4_ = fVar185 * fVar185 * fVar185 * auVar113._0_4_;
          auVar60._8_4_ = fVar180 * fVar180 * fVar180 * auVar113._8_4_;
          auVar60._12_4_ = fVar181 * fVar181 * fVar181 * auVar113._12_4_;
          auVar60._16_4_ = fVar195 * fVar195 * fVar195 * auVar113._16_4_;
          auVar60._20_4_ = fVar206 * fVar206 * fVar206 * auVar113._20_4_;
          auVar60._24_4_ = fVar99 * fVar99 * fVar99 * auVar113._24_4_;
          auVar60._28_4_ = auVar113._28_4_;
          auVar113 = vfmadd231ps_avx512vl(auVar60,auVar125,auVar123);
          auVar61._4_4_ = auVar142._4_4_ * auVar113._4_4_;
          auVar61._0_4_ = auVar142._0_4_ * auVar113._0_4_;
          auVar61._8_4_ = auVar142._8_4_ * auVar113._8_4_;
          auVar61._12_4_ = auVar142._12_4_ * auVar113._12_4_;
          auVar61._16_4_ = auVar142._16_4_ * auVar113._16_4_;
          auVar61._20_4_ = auVar142._20_4_ * auVar113._20_4_;
          auVar61._24_4_ = auVar142._24_4_ * auVar113._24_4_;
          auVar61._28_4_ = auVar123._28_4_;
          auVar62._4_4_ = auVar113._4_4_ * auVar115._4_4_;
          auVar62._0_4_ = auVar113._0_4_ * auVar115._0_4_;
          auVar62._8_4_ = auVar113._8_4_ * auVar115._8_4_;
          auVar62._12_4_ = auVar113._12_4_ * auVar115._12_4_;
          auVar62._16_4_ = auVar113._16_4_ * auVar115._16_4_;
          auVar62._20_4_ = auVar113._20_4_ * auVar115._20_4_;
          auVar62._24_4_ = auVar113._24_4_ * auVar115._24_4_;
          auVar62._28_4_ = auVar115._28_4_;
          auVar115 = vmulps_avx512vl(auVar113,auVar122);
          auVar102 = vfmadd213ps_fma(auVar58,auVar112,ZEXT1632(auVar109));
          auVar7 = vfmadd213ps_fma(auVar59,auVar112,ZEXT1632(auVar104));
          auVar125 = vfmadd213ps_avx512vl(auVar124,auVar112,auVar114);
          auVar123 = vfmadd213ps_avx512vl(auVar61,auVar119,ZEXT1632(auVar105));
          auVar187 = vfnmadd213ps_fma(auVar58,auVar112,ZEXT1632(auVar109));
          auVar109 = vfmadd213ps_fma(auVar62,auVar119,ZEXT1632(auVar103));
          auVar197 = vfnmadd213ps_fma(auVar59,auVar112,ZEXT1632(auVar104));
          auVar104 = vfmadd213ps_fma(auVar115,auVar119,auVar116);
          auVar222 = vfnmadd231ps_fma(auVar114,auVar112,auVar124);
          auVar198 = vfnmadd213ps_fma(auVar61,auVar119,ZEXT1632(auVar105));
          auVar106 = vfnmadd213ps_fma(auVar62,auVar119,ZEXT1632(auVar103));
          auVar107 = vfnmadd231ps_fma(auVar116,auVar119,auVar115);
          auVar116 = vsubps_avx512vl(auVar123,ZEXT1632(auVar187));
          auVar115 = vsubps_avx(ZEXT1632(auVar109),ZEXT1632(auVar197));
          auVar113 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar222));
          auVar63._4_4_ = auVar115._4_4_ * auVar222._4_4_;
          auVar63._0_4_ = auVar115._0_4_ * auVar222._0_4_;
          auVar63._8_4_ = auVar115._8_4_ * auVar222._8_4_;
          auVar63._12_4_ = auVar115._12_4_ * auVar222._12_4_;
          auVar63._16_4_ = auVar115._16_4_ * 0.0;
          auVar63._20_4_ = auVar115._20_4_ * 0.0;
          auVar63._24_4_ = auVar115._24_4_ * 0.0;
          auVar63._28_4_ = auVar124._28_4_;
          auVar105 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar197),auVar113);
          auVar64._4_4_ = auVar113._4_4_ * auVar187._4_4_;
          auVar64._0_4_ = auVar113._0_4_ * auVar187._0_4_;
          auVar64._8_4_ = auVar113._8_4_ * auVar187._8_4_;
          auVar64._12_4_ = auVar113._12_4_ * auVar187._12_4_;
          auVar64._16_4_ = auVar113._16_4_ * 0.0;
          auVar64._20_4_ = auVar113._20_4_ * 0.0;
          auVar64._24_4_ = auVar113._24_4_ * 0.0;
          auVar64._28_4_ = auVar113._28_4_;
          auVar103 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar222),auVar116);
          auVar65._4_4_ = auVar197._4_4_ * auVar116._4_4_;
          auVar65._0_4_ = auVar197._0_4_ * auVar116._0_4_;
          auVar65._8_4_ = auVar197._8_4_ * auVar116._8_4_;
          auVar65._12_4_ = auVar197._12_4_ * auVar116._12_4_;
          auVar65._16_4_ = auVar116._16_4_ * 0.0;
          auVar65._20_4_ = auVar116._20_4_ * 0.0;
          auVar65._24_4_ = auVar116._24_4_ * 0.0;
          auVar65._28_4_ = auVar116._28_4_;
          auVar186 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar187),auVar115);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar186),auVar122,ZEXT1632(auVar103));
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar122,ZEXT1632(auVar105));
          auVar110 = ZEXT1632(auVar108);
          uVar89 = vcmpps_avx512vl(auVar115,auVar110,2);
          bVar88 = (byte)uVar89;
          fVar153 = (float)((uint)(bVar88 & 1) * auVar102._0_4_ |
                           (uint)!(bool)(bVar88 & 1) * auVar198._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          fVar155 = (float)((uint)bVar14 * auVar102._4_4_ | (uint)!bVar14 * auVar198._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          fVar158 = (float)((uint)bVar14 * auVar102._8_4_ | (uint)!bVar14 * auVar198._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          fVar159 = (float)((uint)bVar14 * auVar102._12_4_ | (uint)!bVar14 * auVar198._12_4_);
          auVar122 = ZEXT1632(CONCAT412(fVar159,CONCAT48(fVar158,CONCAT44(fVar155,fVar153))));
          fVar154 = (float)((uint)(bVar88 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar88 & 1) * auVar106._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          fVar157 = (float)((uint)bVar14 * auVar7._4_4_ | (uint)!bVar14 * auVar106._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          fVar156 = (float)((uint)bVar14 * auVar7._8_4_ | (uint)!bVar14 * auVar106._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          fVar160 = (float)((uint)bVar14 * auVar7._12_4_ | (uint)!bVar14 * auVar106._12_4_);
          auVar117 = ZEXT1632(CONCAT412(fVar160,CONCAT48(fVar156,CONCAT44(fVar157,fVar154))));
          auVar143._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar125._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar107._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar107._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar107._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar107._12_4_);
          fVar185 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar125._16_4_);
          auVar143._16_4_ = fVar185;
          fVar179 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar125._20_4_);
          auVar143._20_4_ = fVar179;
          fVar180 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar125._24_4_);
          auVar143._24_4_ = fVar180;
          iVar1 = (uint)(byte)(uVar89 >> 7) * auVar125._28_4_;
          auVar143._28_4_ = iVar1;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar187),auVar123);
          auVar144._0_4_ =
               (uint)(bVar88 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar105._0_4_;
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * auVar105._4_4_;
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * auVar105._8_4_;
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * auVar105._12_4_;
          auVar144._16_4_ = (uint)((byte)(uVar89 >> 4) & 1) * auVar115._16_4_;
          auVar144._20_4_ = (uint)((byte)(uVar89 >> 5) & 1) * auVar115._20_4_;
          auVar144._24_4_ = (uint)((byte)(uVar89 >> 6) & 1) * auVar115._24_4_;
          auVar144._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar115._28_4_;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar197),ZEXT1632(auVar109));
          auVar145._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar102._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar145._4_4_ = (float)((uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * auVar102._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar145._8_4_ = (float)((uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * auVar102._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar145._12_4_ =
               (float)((uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * auVar102._12_4_);
          fVar181 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar115._16_4_);
          auVar145._16_4_ = fVar181;
          fVar195 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar115._20_4_);
          auVar145._20_4_ = fVar195;
          fVar206 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar115._24_4_);
          auVar145._24_4_ = fVar206;
          auVar145._28_4_ = (uint)(byte)(uVar89 >> 7) * auVar115._28_4_;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar222),ZEXT1632(auVar104));
          auVar146._0_4_ =
               (float)((uint)(bVar88 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar88 & 1) * auVar7._0_4_);
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * auVar7._4_4_);
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * auVar7._8_4_);
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar146._12_4_ = (float)((uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * auVar7._12_4_);
          fVar99 = (float)((uint)((byte)(uVar89 >> 4) & 1) * auVar115._16_4_);
          auVar146._16_4_ = fVar99;
          fVar100 = (float)((uint)((byte)(uVar89 >> 5) & 1) * auVar115._20_4_);
          auVar146._20_4_ = fVar100;
          fVar152 = (float)((uint)((byte)(uVar89 >> 6) & 1) * auVar115._24_4_);
          auVar146._24_4_ = fVar152;
          iVar2 = (uint)(byte)(uVar89 >> 7) * auVar115._28_4_;
          auVar146._28_4_ = iVar2;
          auVar147._0_4_ =
               (uint)(bVar88 & 1) * (int)auVar187._0_4_ | (uint)!(bool)(bVar88 & 1) * auVar123._0_4_
          ;
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar147._4_4_ = (uint)bVar14 * (int)auVar187._4_4_ | (uint)!bVar14 * auVar123._4_4_;
          bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar147._8_4_ = (uint)bVar14 * (int)auVar187._8_4_ | (uint)!bVar14 * auVar123._8_4_;
          bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar147._12_4_ = (uint)bVar14 * (int)auVar187._12_4_ | (uint)!bVar14 * auVar123._12_4_;
          auVar147._16_4_ = (uint)!(bool)((byte)(uVar89 >> 4) & 1) * auVar123._16_4_;
          auVar147._20_4_ = (uint)!(bool)((byte)(uVar89 >> 5) & 1) * auVar123._20_4_;
          auVar147._24_4_ = (uint)!(bool)((byte)(uVar89 >> 6) & 1) * auVar123._24_4_;
          auVar147._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar123._28_4_;
          bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar89 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar89 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar89 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar123 = vsubps_avx512vl(auVar147,auVar122);
          auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar197._12_4_ |
                                                   (uint)!bVar18 * auVar109._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar197._8_4_ |
                                                            (uint)!bVar16 * auVar109._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar197._4_4_ |
                                                                     (uint)!bVar14 * auVar109._4_4_,
                                                                     (uint)(bVar88 & 1) *
                                                                     (int)auVar197._0_4_ |
                                                                     (uint)!(bool)(bVar88 & 1) *
                                                                     auVar109._0_4_)))),auVar117);
          auVar216 = ZEXT3264(auVar113);
          auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar222._12_4_ |
                                                   (uint)!bVar19 * auVar104._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar222._8_4_ |
                                                            (uint)!bVar17 * auVar104._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar222._4_4_ |
                                                                     (uint)!bVar15 * auVar104._4_4_,
                                                                     (uint)(bVar88 & 1) *
                                                                     (int)auVar222._0_4_ |
                                                                     (uint)!(bool)(bVar88 & 1) *
                                                                     auVar104._0_4_)))),auVar143);
          auVar124 = vsubps_avx(auVar122,auVar144);
          auVar220 = ZEXT3264(auVar124);
          auVar116 = vsubps_avx(auVar117,auVar145);
          auVar114 = vsubps_avx(auVar143,auVar146);
          auVar66._4_4_ = auVar125._4_4_ * fVar155;
          auVar66._0_4_ = auVar125._0_4_ * fVar153;
          auVar66._8_4_ = auVar125._8_4_ * fVar158;
          auVar66._12_4_ = auVar125._12_4_ * fVar159;
          auVar66._16_4_ = auVar125._16_4_ * 0.0;
          auVar66._20_4_ = auVar125._20_4_ * 0.0;
          auVar66._24_4_ = auVar125._24_4_ * 0.0;
          auVar66._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar66,auVar143,auVar123);
          auVar204._0_4_ = fVar154 * auVar123._0_4_;
          auVar204._4_4_ = fVar157 * auVar123._4_4_;
          auVar204._8_4_ = fVar156 * auVar123._8_4_;
          auVar204._12_4_ = fVar160 * auVar123._12_4_;
          auVar204._16_4_ = auVar123._16_4_ * 0.0;
          auVar204._20_4_ = auVar123._20_4_ * 0.0;
          auVar204._24_4_ = auVar123._24_4_ * 0.0;
          auVar204._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar204,auVar122,auVar113);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar110,ZEXT1632(auVar109));
          auVar209._0_4_ = auVar113._0_4_ * auVar143._0_4_;
          auVar209._4_4_ = auVar113._4_4_ * auVar143._4_4_;
          auVar209._8_4_ = auVar113._8_4_ * auVar143._8_4_;
          auVar209._12_4_ = auVar113._12_4_ * auVar143._12_4_;
          auVar209._16_4_ = auVar113._16_4_ * fVar185;
          auVar209._20_4_ = auVar113._20_4_ * fVar179;
          auVar209._24_4_ = auVar113._24_4_ * fVar180;
          auVar209._28_4_ = 0;
          auVar109 = vfmsub231ps_fma(auVar209,auVar117,auVar125);
          auVar118 = vfmadd231ps_avx512vl(auVar115,auVar110,ZEXT1632(auVar109));
          auVar115 = vmulps_avx512vl(auVar114,auVar144);
          auVar115 = vfmsub231ps_avx512vl(auVar115,auVar124,auVar146);
          auVar67._4_4_ = auVar116._4_4_ * auVar146._4_4_;
          auVar67._0_4_ = auVar116._0_4_ * auVar146._0_4_;
          auVar67._8_4_ = auVar116._8_4_ * auVar146._8_4_;
          auVar67._12_4_ = auVar116._12_4_ * auVar146._12_4_;
          auVar67._16_4_ = auVar116._16_4_ * fVar99;
          auVar67._20_4_ = auVar116._20_4_ * fVar100;
          auVar67._24_4_ = auVar116._24_4_ * fVar152;
          auVar67._28_4_ = iVar2;
          auVar109 = vfmsub231ps_fma(auVar67,auVar145,auVar114);
          auVar210._0_4_ = auVar145._0_4_ * auVar124._0_4_;
          auVar210._4_4_ = auVar145._4_4_ * auVar124._4_4_;
          auVar210._8_4_ = auVar145._8_4_ * auVar124._8_4_;
          auVar210._12_4_ = auVar145._12_4_ * auVar124._12_4_;
          auVar210._16_4_ = fVar181 * auVar124._16_4_;
          auVar210._20_4_ = fVar195 * auVar124._20_4_;
          auVar210._24_4_ = fVar206 * auVar124._24_4_;
          auVar210._28_4_ = 0;
          auVar104 = vfmsub231ps_fma(auVar210,auVar116,auVar144);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar110,auVar115);
          auVar120 = vfmadd231ps_avx512vl(auVar115,auVar110,ZEXT1632(auVar109));
          auVar211 = ZEXT3264(auVar120);
          auVar115 = vmaxps_avx(auVar118,auVar120);
          uVar182 = vcmpps_avx512vl(auVar115,auVar110,2);
          bVar97 = bVar97 & (byte)uVar182;
          if (bVar97 != 0) {
            uVar162 = *(undefined4 *)(ray + sVar96 * 4 + 0x200);
            auVar233._4_4_ = uVar162;
            auVar233._0_4_ = uVar162;
            auVar233._8_4_ = uVar162;
            auVar233._12_4_ = uVar162;
            auVar233._16_4_ = uVar162;
            auVar233._20_4_ = uVar162;
            auVar233._24_4_ = uVar162;
            auVar233._28_4_ = uVar162;
            auVar234 = ZEXT3264(auVar233);
            auVar68._4_4_ = auVar114._4_4_ * auVar113._4_4_;
            auVar68._0_4_ = auVar114._0_4_ * auVar113._0_4_;
            auVar68._8_4_ = auVar114._8_4_ * auVar113._8_4_;
            auVar68._12_4_ = auVar114._12_4_ * auVar113._12_4_;
            auVar68._16_4_ = auVar114._16_4_ * auVar113._16_4_;
            auVar68._20_4_ = auVar114._20_4_ * auVar113._20_4_;
            auVar68._24_4_ = auVar114._24_4_ * auVar113._24_4_;
            auVar68._28_4_ = auVar115._28_4_;
            auVar103 = vfmsub231ps_fma(auVar68,auVar116,auVar125);
            auVar69._4_4_ = auVar125._4_4_ * auVar124._4_4_;
            auVar69._0_4_ = auVar125._0_4_ * auVar124._0_4_;
            auVar69._8_4_ = auVar125._8_4_ * auVar124._8_4_;
            auVar69._12_4_ = auVar125._12_4_ * auVar124._12_4_;
            auVar69._16_4_ = auVar125._16_4_ * auVar124._16_4_;
            auVar69._20_4_ = auVar125._20_4_ * auVar124._20_4_;
            auVar69._24_4_ = auVar125._24_4_ * auVar124._24_4_;
            auVar69._28_4_ = auVar125._28_4_;
            auVar105 = vfmsub231ps_fma(auVar69,auVar123,auVar114);
            auVar70._4_4_ = auVar116._4_4_ * auVar123._4_4_;
            auVar70._0_4_ = auVar116._0_4_ * auVar123._0_4_;
            auVar70._8_4_ = auVar116._8_4_ * auVar123._8_4_;
            auVar70._12_4_ = auVar116._12_4_ * auVar123._12_4_;
            auVar70._16_4_ = auVar116._16_4_ * auVar123._16_4_;
            auVar70._20_4_ = auVar116._20_4_ * auVar123._20_4_;
            auVar70._24_4_ = auVar116._24_4_ * auVar123._24_4_;
            auVar70._28_4_ = auVar116._28_4_;
            auVar102 = vfmsub231ps_fma(auVar70,auVar124,auVar113);
            auVar109 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar102));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar103),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar115 = vrcp14ps_avx512vl(ZEXT1632(auVar104));
            auVar220 = ZEXT3264(auVar115);
            auVar36._8_4_ = 0x3f800000;
            auVar36._0_8_ = 0x3f8000003f800000;
            auVar36._12_4_ = 0x3f800000;
            auVar36._16_4_ = 0x3f800000;
            auVar36._20_4_ = 0x3f800000;
            auVar36._24_4_ = 0x3f800000;
            auVar36._28_4_ = 0x3f800000;
            auVar113 = vfnmadd213ps_avx512vl(auVar115,ZEXT1632(auVar104),auVar36);
            auVar109 = vfmadd132ps_fma(auVar113,auVar115,auVar115);
            auVar216 = ZEXT1664(auVar109);
            auVar71._4_4_ = auVar102._4_4_ * auVar143._4_4_;
            auVar71._0_4_ = auVar102._0_4_ * auVar143._0_4_;
            auVar71._8_4_ = auVar102._8_4_ * auVar143._8_4_;
            auVar71._12_4_ = auVar102._12_4_ * auVar143._12_4_;
            auVar71._16_4_ = fVar185 * 0.0;
            auVar71._20_4_ = fVar179 * 0.0;
            auVar71._24_4_ = fVar180 * 0.0;
            auVar71._28_4_ = iVar1;
            auVar105 = vfmadd231ps_fma(auVar71,auVar117,ZEXT1632(auVar105));
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar122,ZEXT1632(auVar103));
            fVar185 = auVar109._0_4_;
            fVar179 = auVar109._4_4_;
            fVar180 = auVar109._8_4_;
            fVar181 = auVar109._12_4_;
            local_7c0 = ZEXT1632(CONCAT412(auVar105._12_4_ * fVar181,
                                           CONCAT48(auVar105._8_4_ * fVar180,
                                                    CONCAT44(auVar105._4_4_ * fVar179,
                                                             auVar105._0_4_ * fVar185))));
            auVar235 = ZEXT3264(local_7c0);
            uVar182 = vcmpps_avx512vl(local_7c0,auVar233,2);
            uVar30 = vcmpps_avx512vl(local_7c0,local_760,0xd);
            bVar97 = (byte)uVar182 & (byte)uVar30 & bVar97;
            if (bVar97 != 0) {
              uVar98 = vcmpps_avx512vl(ZEXT1632(auVar104),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar98 = bVar97 & uVar98;
              if ((char)uVar98 != '\0') {
                fVar195 = auVar118._0_4_ * fVar185;
                fVar206 = auVar118._4_4_ * fVar179;
                auVar72._4_4_ = fVar206;
                auVar72._0_4_ = fVar195;
                fVar99 = auVar118._8_4_ * fVar180;
                auVar72._8_4_ = fVar99;
                fVar100 = auVar118._12_4_ * fVar181;
                auVar72._12_4_ = fVar100;
                fVar152 = auVar118._16_4_ * 0.0;
                auVar72._16_4_ = fVar152;
                fVar153 = auVar118._20_4_ * 0.0;
                auVar72._20_4_ = fVar153;
                fVar154 = auVar118._24_4_ * 0.0;
                auVar72._24_4_ = fVar154;
                auVar72._28_4_ = auVar118._28_4_;
                auVar194._8_4_ = 0x3f800000;
                auVar194._0_8_ = 0x3f8000003f800000;
                auVar194._12_4_ = 0x3f800000;
                auVar194._16_4_ = 0x3f800000;
                auVar194._20_4_ = 0x3f800000;
                auVar194._24_4_ = 0x3f800000;
                auVar194._28_4_ = 0x3f800000;
                auVar115 = vsubps_avx(auVar194,auVar72);
                local_600._0_4_ =
                     (float)((uint)(bVar88 & 1) * (int)fVar195 |
                            (uint)!(bool)(bVar88 & 1) * auVar115._0_4_);
                bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
                local_600._4_4_ =
                     (float)((uint)bVar14 * (int)fVar206 | (uint)!bVar14 * auVar115._4_4_);
                bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
                local_600._8_4_ =
                     (float)((uint)bVar14 * (int)fVar99 | (uint)!bVar14 * auVar115._8_4_);
                bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                local_600._12_4_ =
                     (float)((uint)bVar14 * (int)fVar100 | (uint)!bVar14 * auVar115._12_4_);
                bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                local_600._16_4_ =
                     (float)((uint)bVar14 * (int)fVar152 | (uint)!bVar14 * auVar115._16_4_);
                bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
                local_600._20_4_ =
                     (float)((uint)bVar14 * (int)fVar153 | (uint)!bVar14 * auVar115._20_4_);
                bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                local_600._24_4_ =
                     (float)((uint)bVar14 * (int)fVar154 | (uint)!bVar14 * auVar115._24_4_);
                bVar14 = SUB81(uVar89 >> 7,0);
                local_600._28_4_ =
                     (float)((uint)bVar14 * auVar118._28_4_ | (uint)!bVar14 * auVar115._28_4_);
                auVar115 = vsubps_avx(auVar119,auVar112);
                auVar109 = vfmadd213ps_fma(auVar115,local_600,auVar112);
                uVar162 = *(undefined4 *)((long)pre->ray_space + sVar96 * 4 + -0x40);
                auVar37._4_4_ = uVar162;
                auVar37._0_4_ = uVar162;
                auVar37._8_4_ = uVar162;
                auVar37._12_4_ = uVar162;
                auVar37._16_4_ = uVar162;
                auVar37._20_4_ = uVar162;
                auVar37._24_4_ = uVar162;
                auVar37._28_4_ = uVar162;
                auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar109._12_4_ + auVar109._12_4_,
                                                              CONCAT48(auVar109._8_4_ +
                                                                       auVar109._8_4_,
                                                                       CONCAT44(auVar109._4_4_ +
                                                                                auVar109._4_4_,
                                                                                auVar109._0_4_ +
                                                                                auVar109._0_4_)))),
                                           auVar37);
                uVar92 = vcmpps_avx512vl(local_7c0,auVar115,6);
                uVar98 = uVar98 & uVar92;
                bVar97 = (byte)uVar98;
                if (bVar97 != 0) {
                  auVar184._0_4_ = auVar120._0_4_ * fVar185;
                  auVar184._4_4_ = auVar120._4_4_ * fVar179;
                  auVar184._8_4_ = auVar120._8_4_ * fVar180;
                  auVar184._12_4_ = auVar120._12_4_ * fVar181;
                  auVar184._16_4_ = auVar120._16_4_ * 0.0;
                  auVar184._20_4_ = auVar120._20_4_ * 0.0;
                  auVar184._24_4_ = auVar120._24_4_ * 0.0;
                  auVar184._28_4_ = 0;
                  auVar205._8_4_ = 0x3f800000;
                  auVar205._0_8_ = 0x3f8000003f800000;
                  auVar205._12_4_ = 0x3f800000;
                  auVar205._16_4_ = 0x3f800000;
                  auVar205._20_4_ = 0x3f800000;
                  auVar205._24_4_ = 0x3f800000;
                  auVar205._28_4_ = 0x3f800000;
                  auVar115 = vsubps_avx(auVar205,auVar184);
                  auVar148._0_4_ =
                       (uint)(bVar88 & 1) * (int)auVar184._0_4_ |
                       (uint)!(bool)(bVar88 & 1) * auVar115._0_4_;
                  bVar14 = (bool)((byte)(uVar89 >> 1) & 1);
                  auVar148._4_4_ =
                       (uint)bVar14 * (int)auVar184._4_4_ | (uint)!bVar14 * auVar115._4_4_;
                  bVar14 = (bool)((byte)(uVar89 >> 2) & 1);
                  auVar148._8_4_ =
                       (uint)bVar14 * (int)auVar184._8_4_ | (uint)!bVar14 * auVar115._8_4_;
                  bVar14 = (bool)((byte)(uVar89 >> 3) & 1);
                  auVar148._12_4_ =
                       (uint)bVar14 * (int)auVar184._12_4_ | (uint)!bVar14 * auVar115._12_4_;
                  bVar14 = (bool)((byte)(uVar89 >> 4) & 1);
                  auVar148._16_4_ =
                       (uint)bVar14 * (int)auVar184._16_4_ | (uint)!bVar14 * auVar115._16_4_;
                  bVar14 = (bool)((byte)(uVar89 >> 5) & 1);
                  auVar148._20_4_ =
                       (uint)bVar14 * (int)auVar184._20_4_ | (uint)!bVar14 * auVar115._20_4_;
                  bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                  auVar148._24_4_ =
                       (uint)bVar14 * (int)auVar184._24_4_ | (uint)!bVar14 * auVar115._24_4_;
                  auVar148._28_4_ = (uint)!SUB81(uVar89 >> 7,0) * auVar115._28_4_;
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar38._16_4_ = 0x40000000;
                  auVar38._20_4_ = 0x40000000;
                  auVar38._24_4_ = 0x40000000;
                  auVar38._28_4_ = 0x40000000;
                  local_5e0 = vfmsub132ps_avx512vl(auVar148,auVar205,auVar38);
                  local_5a0 = (undefined4)lVar93;
                  auVar220 = ZEXT1664(auVar101);
                  local_580 = local_840;
                  uStack_578 = uStack_838;
                  local_570 = local_850;
                  uStack_568 = uStack_848;
                  local_560 = local_860;
                  uStack_558 = uStack_858;
                  pGVar11 = (context->scene->geometries).items[uVar94].ptr;
                  if ((pGVar11->mask & *(uint *)(ray + sVar96 * 4 + 0x240)) != 0) {
                    auVar109 = vcvtsi2ss_avx512f(auVar108,local_5a0);
                    fVar185 = auVar109._0_4_;
                    local_540[0] = (fVar185 + local_600._0_4_ + 0.0) * local_3c0;
                    local_540[1] = (fVar185 + local_600._4_4_ + 1.0) * fStack_3bc;
                    local_540[2] = (fVar185 + local_600._8_4_ + 2.0) * fStack_3b8;
                    local_540[3] = (fVar185 + local_600._12_4_ + 3.0) * fStack_3b4;
                    fStack_530 = (fVar185 + local_600._16_4_ + 4.0) * fStack_3b0;
                    fStack_52c = (fVar185 + local_600._20_4_ + 5.0) * fStack_3ac;
                    fStack_528 = (fVar185 + local_600._24_4_ + 6.0) * fStack_3a8;
                    fStack_524 = fVar185 + local_600._28_4_ + 7.0;
                    local_520 = local_5e0;
                    local_500 = local_7c0;
                    auVar171._8_4_ = 0x7f800000;
                    auVar171._0_8_ = 0x7f8000007f800000;
                    auVar171._12_4_ = 0x7f800000;
                    auVar171._16_4_ = 0x7f800000;
                    auVar171._20_4_ = 0x7f800000;
                    auVar171._24_4_ = 0x7f800000;
                    auVar171._28_4_ = 0x7f800000;
                    auVar115 = vblendmps_avx512vl(auVar171,local_7c0);
                    auVar149._0_4_ =
                         (uint)(bVar97 & 1) * auVar115._0_4_ |
                         (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                    auVar149._4_4_ = (uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar98 >> 2) & 1);
                    auVar149._8_4_ = (uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar98 >> 3) & 1);
                    auVar149._12_4_ = (uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar98 >> 4) & 1);
                    auVar149._16_4_ = (uint)bVar14 * auVar115._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar98 >> 5) & 1);
                    auVar149._20_4_ = (uint)bVar14 * auVar115._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar98 >> 6) & 1);
                    auVar149._24_4_ = (uint)bVar14 * auVar115._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar98 >> 7,0);
                    auVar149._28_4_ = (uint)bVar14 * auVar115._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar115 = vshufps_avx(auVar149,auVar149,0xb1);
                    auVar115 = vminps_avx(auVar149,auVar115);
                    auVar113 = vshufpd_avx(auVar115,auVar115,5);
                    auVar115 = vminps_avx(auVar115,auVar113);
                    auVar113 = vpermpd_avx2(auVar115,0x4e);
                    auVar115 = vminps_avx(auVar115,auVar113);
                    uVar182 = vcmpps_avx512vl(auVar149,auVar115,0);
                    uVar90 = (uint)uVar98;
                    if (((byte)uVar182 & bVar97) != 0) {
                      uVar90 = (uint)((byte)uVar182 & bVar97);
                    }
                    uVar91 = 0;
                    for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                      uVar91 = uVar91 + 1;
                    }
                    uVar89 = (ulong)uVar91;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3e0 = vmovdqa64_avx512vl(auVar221._0_32_);
                      local_5c0 = local_7c0;
                      local_59c = iVar9;
                      local_590 = auVar101;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_540[uVar89]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_520 + uVar89 * 4)))
                        ;
                        *(undefined4 *)(ray + sVar96 * 4 + 0x200) =
                             *(undefined4 *)(local_500 + uVar89 * 4);
                        local_830.context = context->user;
                        fVar181 = local_200._0_4_;
                        fVar179 = 1.0 - fVar181;
                        fVar185 = fVar179 * fVar179 * -3.0;
                        auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar179)),
                                                   ZEXT416((uint)(fVar181 * fVar179)),
                                                   ZEXT416(0xc0000000));
                        auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar181 * fVar179)),
                                                   ZEXT416((uint)(fVar181 * fVar181)),
                                                   ZEXT416(0x40000000));
                        fVar179 = auVar109._0_4_ * 3.0;
                        fVar180 = auVar104._0_4_ * 3.0;
                        fVar181 = fVar181 * fVar181 * 3.0;
                        auVar214._0_4_ = fVar181 * fVar196;
                        auVar214._4_4_ = fVar181 * fVar161;
                        auVar214._8_4_ = fVar181 * fVar177;
                        auVar214._12_4_ = fVar181 * fVar178;
                        auVar163._4_4_ = fVar180;
                        auVar163._0_4_ = fVar180;
                        auVar163._8_4_ = fVar180;
                        auVar163._12_4_ = fVar180;
                        auVar109 = vfmadd132ps_fma(auVar163,auVar214,auVar6);
                        auVar201._4_4_ = fVar179;
                        auVar201._0_4_ = fVar179;
                        auVar201._8_4_ = fVar179;
                        auVar201._12_4_ = fVar179;
                        auVar109 = vfmadd132ps_fma(auVar201,auVar109,auVar29);
                        auVar164._4_4_ = fVar185;
                        auVar164._0_4_ = fVar185;
                        auVar164._8_4_ = fVar185;
                        auVar164._12_4_ = fVar185;
                        auVar109 = vfmadd213ps_fma(auVar164,auVar101,auVar109);
                        auVar236 = vbroadcastss_avx512f(auVar109);
                        auVar176 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar211 = vpermps_avx512f(auVar176,ZEXT1664(auVar109));
                        auVar216 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar216,ZEXT1664(auVar109));
                        local_2c0[0] = (RTCHitN)auVar236[0];
                        local_2c0[1] = (RTCHitN)auVar236[1];
                        local_2c0[2] = (RTCHitN)auVar236[2];
                        local_2c0[3] = (RTCHitN)auVar236[3];
                        local_2c0[4] = (RTCHitN)auVar236[4];
                        local_2c0[5] = (RTCHitN)auVar236[5];
                        local_2c0[6] = (RTCHitN)auVar236[6];
                        local_2c0[7] = (RTCHitN)auVar236[7];
                        local_2c0[8] = (RTCHitN)auVar236[8];
                        local_2c0[9] = (RTCHitN)auVar236[9];
                        local_2c0[10] = (RTCHitN)auVar236[10];
                        local_2c0[0xb] = (RTCHitN)auVar236[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar236[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar236[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar236[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar236[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar236[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar236[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar236[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar236[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar236[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar236[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar236[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar236[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar236[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar236[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar236[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar236[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar236[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar236[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar236[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar236[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar236[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar236[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar236[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar236[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar236[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar236[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar236[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar236[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar236[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar236[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar236[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar236[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar236[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar236[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar236[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar236[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar236[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar236[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar236[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar236[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar236[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar236[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar236[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar236[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar236[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar236[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar236[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar236[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar236[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar236[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar236[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar236[0x3f];
                        local_280 = auVar211;
                        local_180 = local_480._0_8_;
                        uStack_178 = local_480._8_8_;
                        uStack_170 = local_480._16_8_;
                        uStack_168 = local_480._24_8_;
                        uStack_160 = local_480._32_8_;
                        uStack_158 = local_480._40_8_;
                        uStack_150 = local_480._48_8_;
                        uStack_148 = local_480._56_8_;
                        auVar236 = vmovdqa64_avx512f(local_440);
                        local_140 = vmovdqa64_avx512f(auVar236);
                        auVar115 = vpcmpeqd_avx2(auVar236._0_32_,auVar236._0_32_);
                        local_7e8[3] = auVar115;
                        local_7e8[2] = auVar115;
                        local_7e8[1] = auVar115;
                        *local_7e8 = auVar115;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]))
                        ;
                        auVar236 = vmovdqa64_avx512f(local_300);
                        local_740 = vmovdqa64_avx512f(auVar236);
                        local_830.valid = (int *)local_740;
                        local_830.geometryUserPtr = pGVar11->userPtr;
                        local_830.hit = local_2c0;
                        local_830.N = 0x10;
                        local_780 = auVar234._0_32_;
                        local_800._0_4_ = (int)uVar98;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar211 = ZEXT1664(auVar211._0_16_);
                          auVar216 = ZEXT1664(auVar216._0_16_);
                          (*pGVar11->intersectionFilterN)(&local_830);
                          uVar98 = (ulong)(uint)local_800._0_4_;
                          auVar235 = ZEXT3264(local_7c0);
                          auVar234 = ZEXT3264(local_780);
                          auVar236 = vmovdqa64_avx512f(local_740);
                        }
                        bVar97 = (byte)uVar98;
                        uVar182 = vptestmd_avx512f(auVar236,auVar236);
                        if ((short)uVar182 == 0) {
LAB_01c8c3f3:
                          *(int *)(ray + sVar96 * 4 + 0x200) = auVar234._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar211 = ZEXT1664(auVar211._0_16_);
                            auVar216 = ZEXT1664(auVar216._0_16_);
                            (*p_Var12)(&local_830);
                            bVar97 = local_800[0];
                            auVar235 = ZEXT3264(local_7c0);
                            auVar234 = ZEXT3264(local_780);
                            auVar236 = vmovdqa64_avx512f(local_740);
                          }
                          uVar98 = vptestmd_avx512f(auVar236,auVar236);
                          if ((short)uVar98 == 0) goto LAB_01c8c3f3;
                          iVar1 = *(int *)(local_830.hit + 4);
                          iVar2 = *(int *)(local_830.hit + 8);
                          iVar74 = *(int *)(local_830.hit + 0xc);
                          iVar75 = *(int *)(local_830.hit + 0x10);
                          iVar76 = *(int *)(local_830.hit + 0x14);
                          iVar77 = *(int *)(local_830.hit + 0x18);
                          iVar78 = *(int *)(local_830.hit + 0x1c);
                          iVar79 = *(int *)(local_830.hit + 0x20);
                          iVar80 = *(int *)(local_830.hit + 0x24);
                          iVar81 = *(int *)(local_830.hit + 0x28);
                          iVar82 = *(int *)(local_830.hit + 0x2c);
                          iVar83 = *(int *)(local_830.hit + 0x30);
                          iVar84 = *(int *)(local_830.hit + 0x34);
                          iVar85 = *(int *)(local_830.hit + 0x38);
                          iVar86 = *(int *)(local_830.hit + 0x3c);
                          bVar88 = (byte)uVar98;
                          bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar98 >> 7) & 1);
                          bVar21 = (byte)(uVar98 >> 8);
                          bVar22 = (bool)((byte)(uVar98 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar98 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar98 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar98 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar98 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar98 >> 0xe) & 1);
                          bVar28 = SUB81(uVar98 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x300) =
                               (uint)(bVar88 & 1) * *(int *)local_830.hit |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x300);
                          *(uint *)(local_830.ray + 0x304) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x304);
                          *(uint *)(local_830.ray + 0x308) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x308);
                          *(uint *)(local_830.ray + 0x30c) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x30c);
                          *(uint *)(local_830.ray + 0x310) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x310);
                          *(uint *)(local_830.ray + 0x314) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x314);
                          *(uint *)(local_830.ray + 0x318) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x318);
                          *(uint *)(local_830.ray + 0x31c) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x31c);
                          *(uint *)(local_830.ray + 800) =
                               (uint)(bVar21 & 1) * iVar79 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 800);
                          *(uint *)(local_830.ray + 0x324) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x324);
                          *(uint *)(local_830.ray + 0x328) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x328);
                          *(uint *)(local_830.ray + 0x32c) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x32c);
                          *(uint *)(local_830.ray + 0x330) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x330);
                          *(uint *)(local_830.ray + 0x334) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x334);
                          *(uint *)(local_830.ray + 0x338) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x338);
                          *(uint *)(local_830.ray + 0x33c) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x33c);
                          iVar1 = *(int *)(local_830.hit + 0x44);
                          iVar2 = *(int *)(local_830.hit + 0x48);
                          iVar74 = *(int *)(local_830.hit + 0x4c);
                          iVar75 = *(int *)(local_830.hit + 0x50);
                          iVar76 = *(int *)(local_830.hit + 0x54);
                          iVar77 = *(int *)(local_830.hit + 0x58);
                          iVar78 = *(int *)(local_830.hit + 0x5c);
                          iVar79 = *(int *)(local_830.hit + 0x60);
                          iVar80 = *(int *)(local_830.hit + 100);
                          iVar81 = *(int *)(local_830.hit + 0x68);
                          iVar82 = *(int *)(local_830.hit + 0x6c);
                          iVar83 = *(int *)(local_830.hit + 0x70);
                          iVar84 = *(int *)(local_830.hit + 0x74);
                          iVar85 = *(int *)(local_830.hit + 0x78);
                          iVar86 = *(int *)(local_830.hit + 0x7c);
                          bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar98 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar98 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar98 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar98 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar98 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar98 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar98 >> 0xe) & 1);
                          bVar28 = SUB81(uVar98 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x340) =
                               (uint)(bVar88 & 1) * *(int *)(local_830.hit + 0x40) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x340);
                          *(uint *)(local_830.ray + 0x344) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x344);
                          *(uint *)(local_830.ray + 0x348) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x348);
                          *(uint *)(local_830.ray + 0x34c) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x34c);
                          *(uint *)(local_830.ray + 0x350) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x350);
                          *(uint *)(local_830.ray + 0x354) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x354);
                          *(uint *)(local_830.ray + 0x358) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x358);
                          *(uint *)(local_830.ray + 0x35c) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x35c);
                          *(uint *)(local_830.ray + 0x360) =
                               (uint)(bVar21 & 1) * iVar79 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x360);
                          *(uint *)(local_830.ray + 0x364) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x364);
                          *(uint *)(local_830.ray + 0x368) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x368);
                          *(uint *)(local_830.ray + 0x36c) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x36c);
                          *(uint *)(local_830.ray + 0x370) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x370);
                          *(uint *)(local_830.ray + 0x374) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x374);
                          *(uint *)(local_830.ray + 0x378) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x378);
                          *(uint *)(local_830.ray + 0x37c) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x37c);
                          iVar1 = *(int *)(local_830.hit + 0x84);
                          iVar2 = *(int *)(local_830.hit + 0x88);
                          iVar74 = *(int *)(local_830.hit + 0x8c);
                          iVar75 = *(int *)(local_830.hit + 0x90);
                          iVar76 = *(int *)(local_830.hit + 0x94);
                          iVar77 = *(int *)(local_830.hit + 0x98);
                          iVar78 = *(int *)(local_830.hit + 0x9c);
                          iVar79 = *(int *)(local_830.hit + 0xa0);
                          iVar80 = *(int *)(local_830.hit + 0xa4);
                          iVar81 = *(int *)(local_830.hit + 0xa8);
                          iVar82 = *(int *)(local_830.hit + 0xac);
                          iVar83 = *(int *)(local_830.hit + 0xb0);
                          iVar84 = *(int *)(local_830.hit + 0xb4);
                          iVar85 = *(int *)(local_830.hit + 0xb8);
                          iVar86 = *(int *)(local_830.hit + 0xbc);
                          bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar98 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar98 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar98 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar98 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar98 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar98 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar98 >> 0xe) & 1);
                          bVar28 = SUB81(uVar98 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x380) =
                               (uint)(bVar88 & 1) * *(int *)(local_830.hit + 0x80) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x380);
                          *(uint *)(local_830.ray + 900) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_830.ray + 900);
                          *(uint *)(local_830.ray + 0x388) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x388);
                          *(uint *)(local_830.ray + 0x38c) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x38c);
                          *(uint *)(local_830.ray + 0x390) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x390);
                          *(uint *)(local_830.ray + 0x394) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x394);
                          *(uint *)(local_830.ray + 0x398) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x398);
                          *(uint *)(local_830.ray + 0x39c) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x39c);
                          *(uint *)(local_830.ray + 0x3a0) =
                               (uint)(bVar21 & 1) * iVar79 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x3a0);
                          *(uint *)(local_830.ray + 0x3a4) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3a4);
                          *(uint *)(local_830.ray + 0x3a8) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3a8);
                          *(uint *)(local_830.ray + 0x3ac) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3ac);
                          *(uint *)(local_830.ray + 0x3b0) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3b0);
                          *(uint *)(local_830.ray + 0x3b4) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3b4);
                          *(uint *)(local_830.ray + 0x3b8) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x3b8);
                          *(uint *)(local_830.ray + 0x3bc) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x3bc);
                          iVar1 = *(int *)(local_830.hit + 0xc4);
                          iVar2 = *(int *)(local_830.hit + 200);
                          iVar74 = *(int *)(local_830.hit + 0xcc);
                          iVar75 = *(int *)(local_830.hit + 0xd0);
                          iVar76 = *(int *)(local_830.hit + 0xd4);
                          iVar77 = *(int *)(local_830.hit + 0xd8);
                          iVar78 = *(int *)(local_830.hit + 0xdc);
                          iVar79 = *(int *)(local_830.hit + 0xe0);
                          iVar80 = *(int *)(local_830.hit + 0xe4);
                          iVar81 = *(int *)(local_830.hit + 0xe8);
                          iVar82 = *(int *)(local_830.hit + 0xec);
                          iVar83 = *(int *)(local_830.hit + 0xf0);
                          iVar84 = *(int *)(local_830.hit + 0xf4);
                          iVar85 = *(int *)(local_830.hit + 0xf8);
                          iVar86 = *(int *)(local_830.hit + 0xfc);
                          bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar98 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar98 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar98 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar98 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar98 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar98 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar98 >> 0xe) & 1);
                          bVar28 = SUB81(uVar98 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x3c0) =
                               (uint)(bVar88 & 1) * *(int *)(local_830.hit + 0xc0) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x3c0);
                          *(uint *)(local_830.ray + 0x3c4) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x3c4);
                          *(uint *)(local_830.ray + 0x3c8) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x3c8);
                          *(uint *)(local_830.ray + 0x3cc) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x3cc);
                          *(uint *)(local_830.ray + 0x3d0) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x3d0);
                          *(uint *)(local_830.ray + 0x3d4) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x3d4);
                          *(uint *)(local_830.ray + 0x3d8) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x3d8);
                          *(uint *)(local_830.ray + 0x3dc) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3dc);
                          *(uint *)(local_830.ray + 0x3e0) =
                               (uint)(bVar21 & 1) * iVar79 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x3e0);
                          *(uint *)(local_830.ray + 0x3e4) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3e4);
                          *(uint *)(local_830.ray + 1000) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 1000);
                          *(uint *)(local_830.ray + 0x3ec) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3ec);
                          *(uint *)(local_830.ray + 0x3f0) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3f0);
                          *(uint *)(local_830.ray + 0x3f4) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x3f4);
                          *(uint *)(local_830.ray + 0x3f8) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x3f8);
                          *(uint *)(local_830.ray + 0x3fc) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x3fc);
                          iVar1 = *(int *)(local_830.hit + 0x104);
                          iVar2 = *(int *)(local_830.hit + 0x108);
                          iVar74 = *(int *)(local_830.hit + 0x10c);
                          iVar75 = *(int *)(local_830.hit + 0x110);
                          iVar76 = *(int *)(local_830.hit + 0x114);
                          iVar77 = *(int *)(local_830.hit + 0x118);
                          iVar78 = *(int *)(local_830.hit + 0x11c);
                          iVar79 = *(int *)(local_830.hit + 0x120);
                          iVar80 = *(int *)(local_830.hit + 0x124);
                          iVar81 = *(int *)(local_830.hit + 0x128);
                          iVar82 = *(int *)(local_830.hit + 300);
                          iVar83 = *(int *)(local_830.hit + 0x130);
                          iVar84 = *(int *)(local_830.hit + 0x134);
                          iVar85 = *(int *)(local_830.hit + 0x138);
                          iVar86 = *(int *)(local_830.hit + 0x13c);
                          bVar14 = (bool)((byte)(uVar98 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar98 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar98 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar98 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar98 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar98 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar98 >> 7) & 1);
                          bVar22 = (bool)((byte)(uVar98 >> 9) & 1);
                          bVar23 = (bool)((byte)(uVar98 >> 10) & 1);
                          bVar24 = (bool)((byte)(uVar98 >> 0xb) & 1);
                          bVar25 = (bool)((byte)(uVar98 >> 0xc) & 1);
                          bVar26 = (bool)((byte)(uVar98 >> 0xd) & 1);
                          bVar27 = (bool)((byte)(uVar98 >> 0xe) & 1);
                          bVar28 = SUB81(uVar98 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x400) =
                               (uint)(bVar88 & 1) * *(int *)(local_830.hit + 0x100) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_830.ray + 0x400);
                          *(uint *)(local_830.ray + 0x404) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x404);
                          *(uint *)(local_830.ray + 0x408) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x408);
                          *(uint *)(local_830.ray + 0x40c) =
                               (uint)bVar16 * iVar74 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x40c);
                          *(uint *)(local_830.ray + 0x410) =
                               (uint)bVar17 * iVar75 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x410);
                          *(uint *)(local_830.ray + 0x414) =
                               (uint)bVar18 * iVar76 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x414);
                          *(uint *)(local_830.ray + 0x418) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x418);
                          *(uint *)(local_830.ray + 0x41c) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x41c);
                          *(uint *)(local_830.ray + 0x420) =
                               (uint)(bVar21 & 1) * iVar79 |
                               (uint)!(bool)(bVar21 & 1) * *(int *)(local_830.ray + 0x420);
                          *(uint *)(local_830.ray + 0x424) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x424);
                          *(uint *)(local_830.ray + 0x428) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x428);
                          *(uint *)(local_830.ray + 0x42c) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x42c);
                          *(uint *)(local_830.ray + 0x430) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x430);
                          *(uint *)(local_830.ray + 0x434) =
                               (uint)bVar26 * iVar84 |
                               (uint)!bVar26 * *(int *)(local_830.ray + 0x434);
                          *(uint *)(local_830.ray + 0x438) =
                               (uint)bVar27 * iVar85 |
                               (uint)!bVar27 * *(int *)(local_830.ray + 0x438);
                          *(uint *)(local_830.ray + 0x43c) =
                               (uint)bVar28 * iVar86 |
                               (uint)!bVar28 * *(int *)(local_830.ray + 0x43c);
                          auVar236 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140)
                                                      );
                          auVar236 = vmovdqu32_avx512f(auVar236);
                          *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar236;
                          auVar236 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180)
                                                      );
                          auVar236 = vmovdqu32_avx512f(auVar236);
                          *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar236;
                          auVar236 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0)
                                                      );
                          auVar236 = vmovdqa32_avx512f(auVar236);
                          *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar236;
                          auVar236 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200)
                                                      );
                          auVar236 = vmovdqa32_avx512f(auVar236);
                          *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar236;
                          auVar234 = ZEXT464(*(uint *)(ray + sVar96 * 4 + 0x200));
                        }
                        auVar220 = ZEXT1664(auVar101);
                        bVar97 = ~(byte)(1 << ((uint)uVar89 & 0x1f)) & bVar97;
                        uVar162 = auVar234._0_4_;
                        auVar172._4_4_ = uVar162;
                        auVar172._0_4_ = uVar162;
                        auVar172._8_4_ = uVar162;
                        auVar172._12_4_ = uVar162;
                        auVar172._16_4_ = uVar162;
                        auVar172._20_4_ = uVar162;
                        auVar172._24_4_ = uVar162;
                        auVar172._28_4_ = uVar162;
                        uVar182 = vcmpps_avx512vl(auVar235._0_32_,auVar172,2);
                        if ((bVar97 & (byte)uVar182) == 0) goto LAB_01c8c483;
                        bVar97 = bVar97 & (byte)uVar182;
                        uVar98 = (ulong)bVar97;
                        auVar173._8_4_ = 0x7f800000;
                        auVar173._0_8_ = 0x7f8000007f800000;
                        auVar173._12_4_ = 0x7f800000;
                        auVar173._16_4_ = 0x7f800000;
                        auVar173._20_4_ = 0x7f800000;
                        auVar173._24_4_ = 0x7f800000;
                        auVar173._28_4_ = 0x7f800000;
                        auVar115 = vblendmps_avx512vl(auVar173,auVar235._0_32_);
                        auVar150._0_4_ =
                             (uint)(bVar97 & 1) * auVar115._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar97 >> 1 & 1);
                        auVar150._4_4_ = (uint)bVar14 * auVar115._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar97 >> 2 & 1);
                        auVar150._8_4_ = (uint)bVar14 * auVar115._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar97 >> 3 & 1);
                        auVar150._12_4_ =
                             (uint)bVar14 * auVar115._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar97 >> 4 & 1);
                        auVar150._16_4_ =
                             (uint)bVar14 * auVar115._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar97 >> 5 & 1);
                        auVar150._20_4_ =
                             (uint)bVar14 * auVar115._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar97 >> 6 & 1);
                        auVar150._24_4_ =
                             (uint)bVar14 * auVar115._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar150._28_4_ =
                             (uint)(bVar97 >> 7) * auVar115._28_4_ |
                             (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                        auVar115 = vshufps_avx(auVar150,auVar150,0xb1);
                        auVar115 = vminps_avx(auVar150,auVar115);
                        auVar113 = vshufpd_avx(auVar115,auVar115,5);
                        auVar115 = vminps_avx(auVar115,auVar113);
                        auVar113 = vpermpd_avx2(auVar115,0x4e);
                        auVar115 = vminps_avx(auVar115,auVar113);
                        uVar182 = vcmpps_avx512vl(auVar150,auVar115,0);
                        bVar88 = (byte)uVar182 & bVar97;
                        if (bVar88 != 0) {
                          bVar97 = bVar88;
                        }
                        uVar90 = 0;
                        for (uVar91 = (uint)bVar97; (uVar91 & 1) == 0;
                            uVar91 = uVar91 >> 1 | 0x80000000) {
                          uVar90 = uVar90 + 1;
                        }
                        uVar89 = (ulong)uVar90;
                      } while( true );
                    }
                    fVar185 = local_540[uVar89];
                    uVar162 = *(undefined4 *)(local_520 + uVar89 * 4);
                    fVar180 = 1.0 - fVar185;
                    fVar179 = fVar180 * fVar180 * -3.0;
                    auVar211 = ZEXT464((uint)fVar179);
                    auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar180 * fVar180)),
                                               ZEXT416((uint)(fVar185 * fVar180)),
                                               ZEXT416(0xc0000000));
                    auVar104 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar180)),
                                               ZEXT416((uint)(fVar185 * fVar185)),
                                               ZEXT416(0x40000000));
                    fVar180 = auVar109._0_4_ * 3.0;
                    fVar181 = auVar104._0_4_ * 3.0;
                    fVar195 = fVar185 * fVar185 * 3.0;
                    auVar213._0_4_ = fVar195 * fVar196;
                    auVar213._4_4_ = fVar195 * fVar161;
                    auVar213._8_4_ = fVar195 * fVar177;
                    auVar213._12_4_ = fVar195 * fVar178;
                    auVar216 = ZEXT1664(auVar213);
                    auVar190._4_4_ = fVar181;
                    auVar190._0_4_ = fVar181;
                    auVar190._8_4_ = fVar181;
                    auVar190._12_4_ = fVar181;
                    auVar109 = vfmadd132ps_fma(auVar190,auVar213,auVar6);
                    auVar200._4_4_ = fVar180;
                    auVar200._0_4_ = fVar180;
                    auVar200._8_4_ = fVar180;
                    auVar200._12_4_ = fVar180;
                    auVar109 = vfmadd132ps_fma(auVar200,auVar109,auVar29);
                    auVar191._4_4_ = fVar179;
                    auVar191._0_4_ = fVar179;
                    auVar191._8_4_ = fVar179;
                    auVar191._12_4_ = fVar179;
                    auVar109 = vfmadd213ps_fma(auVar191,auVar101,auVar109);
                    *(undefined4 *)(ray + sVar96 * 4 + 0x200) =
                         *(undefined4 *)(local_500 + uVar89 * 4);
                    *(int *)(ray + sVar96 * 4 + 0x300) = auVar109._0_4_;
                    uVar10 = vextractps_avx(auVar109,1);
                    *(undefined4 *)(ray + sVar96 * 4 + 0x340) = uVar10;
                    uVar10 = vextractps_avx(auVar109,2);
                    *(undefined4 *)(ray + sVar96 * 4 + 0x380) = uVar10;
                    *(float *)(ray + sVar96 * 4 + 0x3c0) = fVar185;
                    *(undefined4 *)(ray + sVar96 * 4 + 0x400) = uVar162;
                    *(undefined4 *)(ray + sVar96 * 4 + 0x440) = uVar3;
                    *(uint *)(ray + sVar96 * 4 + 0x480) = uVar94;
                    *(uint *)(ray + sVar96 * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + sVar96 * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01c8c0a5;
      }
LAB_01c8b70e:
      uVar3 = *(undefined4 *)(ray + sVar96 * 4 + 0x200);
      auVar35._4_4_ = uVar3;
      auVar35._0_4_ = uVar3;
      auVar35._8_4_ = uVar3;
      auVar35._12_4_ = uVar3;
      auVar35._16_4_ = uVar3;
      auVar35._20_4_ = uVar3;
      auVar35._24_4_ = uVar3;
      auVar35._28_4_ = uVar3;
      uVar182 = vcmpps_avx512vl(local_320,auVar35,2);
      uVar94 = (uint)uVar95 & (uint)uVar182;
      uVar95 = (ulong)uVar94;
    } while (uVar94 != 0);
  }
  return;
LAB_01c8c483:
  auVar115 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar236 = ZEXT3264(auVar115);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar176 = ZEXT1664(auVar109);
  auVar237 = ZEXT464(0x35000000);
  auVar115 = vmovdqa64_avx512vl(local_3e0);
  auVar221 = ZEXT3264(auVar115);
LAB_01c8c0a5:
  lVar93 = lVar93 + 8;
  if (iVar9 <= (int)lVar93) goto LAB_01c8b70e;
  goto LAB_01c8b7b3;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }